

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O3

void ConvertBGRAToRGB_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  bool bVar1;
  byte bVar2;
  byte bVar10;
  byte bVar18;
  byte bVar26;
  char cVar34;
  char cVar39;
  char cVar44;
  char cVar51;
  char cVar58;
  char cVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [14];
  undefined1 auVar133 [12];
  unkbyte10 Var134;
  undefined1 auVar135 [14];
  undefined1 auVar136 [12];
  unkbyte10 Var137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [14];
  undefined1 auVar159 [12];
  unkbyte10 Var160;
  undefined1 auVar161 [14];
  undefined1 auVar162 [12];
  unkbyte10 Var163;
  undefined1 auVar164 [16];
  uint uVar165;
  undefined4 uVar166;
  undefined1 auVar169 [12];
  undefined1 auVar170 [12];
  undefined1 auVar171 [12];
  undefined1 auVar175 [16];
  undefined4 uVar184;
  undefined1 auVar188 [12];
  undefined1 auVar189 [12];
  undefined1 auVar193 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined4 uVar205;
  undefined1 auVar209 [12];
  undefined1 auVar210 [12];
  undefined1 auVar214 [16];
  undefined1 auVar222 [16];
  ushort uVar226;
  ushort uVar227;
  ushort uVar249;
  undefined4 uVar228;
  ushort uVar257;
  undefined1 auVar232 [12];
  undefined1 auVar233 [12];
  ushort uVar250;
  ushort uVar251;
  ushort uVar252;
  ushort uVar253;
  ushort uVar254;
  ushort uVar255;
  ushort uVar256;
  ushort uVar258;
  ushort uVar259;
  ushort uVar260;
  undefined1 auVar237 [16];
  undefined1 auVar245 [16];
  ushort uVar261;
  ushort uVar262;
  ushort uVar263;
  undefined4 uVar264;
  undefined1 auVar268 [12];
  undefined1 auVar269 [12];
  ushort uVar285;
  ushort uVar286;
  ushort uVar287;
  ushort uVar288;
  ushort uVar289;
  ushort uVar290;
  undefined1 auVar273 [16];
  undefined1 auVar282 [16];
  ushort uVar291;
  ushort uVar292;
  undefined4 uVar293;
  undefined1 auVar297 [12];
  undefined1 auVar298 [12];
  ushort uVar315;
  ushort uVar316;
  ushort uVar317;
  ushort uVar318;
  ushort uVar319;
  ushort uVar320;
  undefined1 auVar302 [16];
  undefined1 auVar310 [16];
  undefined1 auVar313 [16];
  ushort uVar321;
  ushort uVar322;
  undefined4 uVar323;
  undefined1 auVar327 [12];
  ushort uVar343;
  ushort uVar344;
  ushort uVar345;
  ushort uVar347;
  undefined1 auVar330 [16];
  undefined1 auVar338 [16];
  ushort uVar342;
  ushort uVar346;
  ushort uVar348;
  undefined1 auVar339 [16];
  undefined4 uVar349;
  undefined1 auVar353 [12];
  undefined1 auVar356 [16];
  undefined1 auVar364 [16];
  undefined1 auVar372 [16];
  ushort uVar378;
  undefined4 uVar379;
  undefined1 auVar383 [12];
  ushort uVar403;
  ushort uVar406;
  ushort uVar411;
  ushort uVar412;
  ushort uVar413;
  ushort uVar414;
  undefined1 auVar386 [16];
  undefined1 auVar393 [16];
  ushort uVar415;
  undefined1 auVar416 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  undefined6 uVar167;
  undefined1 auVar176 [16];
  undefined8 uVar168;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar172 [14];
  undefined1 auVar173 [14];
  undefined1 auVar174 [14];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined6 uVar185;
  undefined1 auVar194 [16];
  undefined8 uVar186;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar187 [12];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar190 [14];
  undefined1 auVar191 [14];
  undefined1 auVar192 [14];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar204 [16];
  undefined6 uVar206;
  undefined1 auVar215 [16];
  undefined8 uVar207;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar208 [12];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar211 [14];
  undefined1 auVar212 [14];
  undefined1 auVar213 [14];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined6 uVar229;
  undefined1 auVar238 [16];
  undefined8 uVar230;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar231 [12];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar234 [14];
  undefined1 auVar235 [14];
  undefined1 auVar236 [14];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined6 uVar265;
  undefined1 auVar274 [16];
  undefined8 uVar266;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar267 [12];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar270 [14];
  undefined1 auVar271 [14];
  undefined1 auVar272 [14];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined6 uVar294;
  undefined1 auVar303 [16];
  undefined8 uVar295;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar296 [12];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar299 [14];
  undefined1 auVar300 [14];
  undefined1 auVar301 [14];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar314 [16];
  undefined6 uVar324;
  undefined1 auVar331 [16];
  undefined8 uVar325;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar326 [12];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar328 [14];
  undefined1 auVar329 [14];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined6 uVar350;
  undefined1 auVar357 [16];
  undefined1 auVar365 [16];
  undefined8 uVar351;
  undefined1 auVar358 [16];
  undefined1 auVar366 [16];
  undefined1 auVar359 [16];
  undefined1 auVar367 [16];
  undefined1 auVar352 [12];
  undefined1 auVar360 [16];
  undefined1 auVar368 [16];
  undefined1 auVar361 [16];
  undefined1 auVar369 [16];
  undefined1 auVar354 [14];
  undefined1 auVar355 [14];
  undefined1 auVar362 [16];
  undefined1 auVar370 [16];
  undefined1 auVar363 [16];
  undefined1 auVar371 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  byte bVar375;
  char cVar376;
  byte bVar377;
  undefined6 uVar380;
  undefined1 auVar394 [16];
  undefined8 uVar381;
  undefined1 auVar387 [16];
  undefined1 auVar395 [16];
  undefined1 auVar388 [16];
  undefined1 auVar396 [16];
  undefined1 auVar382 [12];
  undefined1 auVar389 [16];
  undefined1 auVar397 [16];
  undefined1 auVar390 [16];
  undefined1 auVar398 [16];
  undefined1 auVar384 [14];
  undefined1 auVar385 [14];
  undefined1 auVar391 [16];
  undefined1 auVar399 [16];
  undefined1 auVar392 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  byte bVar404;
  byte bVar405;
  char cVar407;
  char cVar408;
  byte bVar409;
  byte bVar410;
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  byte bVar426;
  char cVar427;
  byte bVar428;
  
  auVar164 = _DAT_0014a790;
  uVar165 = num_pixels;
  if (0x1f < num_pixels) {
    do {
      auVar222 = *(undefined1 (*) [16])src;
      cVar43 = (*(undefined1 (*) [16])((long)src + 0x10))[4];
      cVar35 = (*(undefined1 (*) [16])((long)src + 0x10))[5];
      cVar28 = (*(undefined1 (*) [16])((long)src + 0x10))[6];
      auVar339 = *(undefined1 (*) [16])((long)src + 0x20);
      cVar42 = (*(undefined1 (*) [16])((long)src + 0x30))[4];
      cVar36 = (*(undefined1 (*) [16])((long)src + 0x30))[5];
      cVar33 = (*(undefined1 (*) [16])((long)src + 0x30))[6];
      auVar313 = *(undefined1 (*) [16])((long)src + 0x40);
      cVar41 = (*(undefined1 (*) [16])((long)src + 0x50))[4];
      cVar37 = (*(undefined1 (*) [16])((long)src + 0x50))[5];
      cVar32 = (*(undefined1 (*) [16])((long)src + 0x50))[6];
      auVar282 = *(undefined1 (*) [16])((long)src + 0x60);
      cVar49 = (*(undefined1 (*) [16])((long)src + 0x70))[4];
      cVar38 = (*(undefined1 (*) [16])((long)src + 0x70))[5];
      cVar34 = (*(undefined1 (*) [16])((long)src + 0x70))[6];
      auVar392._0_14_ = auVar222._0_14_;
      auVar392[0xe] = auVar222[7];
      auVar392[0xf] = (*(undefined1 (*) [16])((long)src + 0x10))[7];
      auVar391._14_2_ = auVar392._14_2_;
      auVar391._0_13_ = auVar222._0_13_;
      auVar391[0xd] = cVar28;
      bVar409 = auVar222[6];
      auVar390._13_3_ = auVar391._13_3_;
      auVar390._0_12_ = auVar222._0_12_;
      auVar390[0xc] = bVar409;
      auVar389._12_4_ = auVar390._12_4_;
      auVar389._0_11_ = auVar222._0_11_;
      auVar389[0xb] = cVar35;
      cVar407 = auVar222[5];
      auVar388._11_5_ = auVar389._11_5_;
      auVar388._0_10_ = auVar222._0_10_;
      auVar388[10] = cVar407;
      auVar387._10_6_ = auVar388._10_6_;
      auVar387._0_9_ = auVar222._0_9_;
      auVar387[9] = cVar43;
      bVar404 = auVar222[4];
      auVar386._9_7_ = auVar387._9_7_;
      auVar386._0_8_ = auVar222._0_8_;
      auVar386[8] = bVar404;
      auVar116._1_8_ = auVar386._8_8_;
      auVar116[0] = (*(undefined1 (*) [16])((long)src + 0x10))[3];
      auVar116._9_7_ = 0;
      auVar115._10_6_ = 0;
      auVar115._0_10_ = SUB1610(auVar116 << 0x38,6);
      auVar114._11_5_ = 0;
      auVar114._0_11_ = SUB1611(auVar115 << 0x30,5);
      auVar425._12_4_ = 0;
      auVar425._0_12_ = SUB1612(auVar114 << 0x28,4);
      auVar310._13_3_ = 0;
      auVar310._0_13_ = SUB1613(auVar425 << 0x20,3);
      auVar201._14_2_ = 0;
      auVar201._0_14_ = SUB1614(auVar310 << 0x18,2);
      auVar201 = auVar201 << 0x10;
      auVar423._0_14_ = auVar339._0_14_;
      auVar423[0xe] = auVar339[7];
      auVar423[0xf] = (*(undefined1 (*) [16])((long)src + 0x30))[7];
      auVar422._14_2_ = auVar423._14_2_;
      auVar422._0_13_ = auVar339._0_13_;
      auVar422[0xd] = cVar33;
      bVar428 = auVar339[6];
      auVar421._13_3_ = auVar422._13_3_;
      auVar421._0_12_ = auVar339._0_12_;
      auVar421[0xc] = bVar428;
      auVar420._12_4_ = auVar421._12_4_;
      auVar420._0_11_ = auVar339._0_11_;
      auVar420[0xb] = cVar36;
      cVar427 = auVar339[5];
      auVar419._11_5_ = auVar420._11_5_;
      auVar419._0_10_ = auVar339._0_10_;
      auVar419[10] = cVar427;
      auVar418._10_6_ = auVar419._10_6_;
      auVar418._0_9_ = auVar339._0_9_;
      auVar418[9] = cVar42;
      bVar426 = auVar339[4];
      auVar417._9_7_ = auVar418._9_7_;
      auVar417._0_8_ = auVar339._0_8_;
      auVar417[8] = bVar426;
      auVar121._1_8_ = auVar417._8_8_;
      auVar121[0] = (*(undefined1 (*) [16])((long)src + 0x30))[3];
      auVar121._9_7_ = 0;
      auVar120._10_6_ = 0;
      auVar120._0_10_ = SUB1610(auVar121 << 0x38,6);
      auVar119._11_5_ = 0;
      auVar119._0_11_ = SUB1611(auVar120 << 0x30,5);
      auVar118._12_4_ = 0;
      auVar118._0_12_ = SUB1612(auVar119 << 0x28,4);
      auVar117._13_3_ = 0;
      auVar117._0_13_ = SUB1613(auVar118 << 0x20,3);
      auVar416._14_2_ = 0;
      auVar416._0_14_ = SUB1614(auVar117 << 0x18,2);
      auVar416 = auVar416 << 0x10;
      auVar244._0_14_ = auVar201._0_14_;
      auVar244[0xe] = (*(undefined1 (*) [16])((long)src + 0x10))[3];
      auVar244[0xf] = (*(undefined1 (*) [16])((long)src + 0x10))[0xb];
      auVar243._14_2_ = auVar244._14_2_;
      auVar243._0_13_ = auVar201._0_13_;
      auVar243[0xd] = auVar222[0xb];
      auVar242._13_3_ = auVar243._13_3_;
      auVar242._0_12_ = auVar201._0_12_;
      auVar242[0xc] = auVar222[3];
      auVar241._12_4_ = auVar242._12_4_;
      auVar241._0_11_ = auVar201._0_11_;
      auVar241[0xb] = (*(undefined1 (*) [16])((long)src + 0x10))[10];
      auVar240._11_5_ = auVar241._11_5_;
      auVar240._0_10_ = auVar201._0_10_;
      auVar240[10] = (*(undefined1 (*) [16])((long)src + 0x10))[2];
      auVar239._10_6_ = auVar240._10_6_;
      auVar239._0_9_ = auVar201._0_9_;
      auVar239[9] = auVar222[10];
      auVar238._9_7_ = auVar239._9_7_;
      auVar238._0_8_ = auVar201._0_8_;
      auVar238[8] = auVar222[2];
      auVar126._1_8_ = auVar238._8_8_;
      auVar126[0] = (*(undefined1 (*) [16])((long)src + 0x10))[9];
      auVar126._9_7_ = 0;
      auVar125._10_6_ = 0;
      auVar125._0_10_ = SUB1610(auVar126 << 0x38,6);
      auVar124._11_5_ = 0;
      auVar124._0_11_ = SUB1611(auVar125 << 0x30,5);
      auVar123._12_4_ = 0;
      auVar123._0_12_ = SUB1612(auVar124 << 0x28,4);
      auVar122._13_3_ = 0;
      auVar122._0_13_ = SUB1613(auVar123 << 0x20,3);
      auVar237._14_2_ = 0;
      auVar237._0_14_ = SUB1614(auVar122 << 0x18,2);
      auVar237 = auVar237 << 0x10;
      auVar182._0_14_ = auVar416._0_14_;
      auVar182[0xe] = (*(undefined1 (*) [16])((long)src + 0x30))[3];
      auVar182[0xf] = (*(undefined1 (*) [16])((long)src + 0x30))[0xb];
      auVar181._14_2_ = auVar182._14_2_;
      auVar181._0_13_ = auVar416._0_13_;
      auVar181[0xd] = auVar339[0xb];
      auVar180._13_3_ = auVar181._13_3_;
      auVar180._0_12_ = auVar416._0_12_;
      auVar180[0xc] = auVar339[3];
      auVar179._12_4_ = auVar180._12_4_;
      auVar179._0_11_ = auVar416._0_11_;
      auVar179[0xb] = (*(undefined1 (*) [16])((long)src + 0x30))[10];
      auVar178._11_5_ = auVar179._11_5_;
      auVar178._0_10_ = auVar416._0_10_;
      auVar178[10] = (*(undefined1 (*) [16])((long)src + 0x30))[2];
      auVar177._10_6_ = auVar178._10_6_;
      auVar177._0_9_ = auVar416._0_9_;
      auVar177[9] = auVar339[10];
      auVar176._9_7_ = auVar177._9_7_;
      auVar176._0_8_ = auVar416._0_8_;
      auVar176[8] = auVar339[2];
      auVar131._1_8_ = auVar176._8_8_;
      auVar131[0] = (*(undefined1 (*) [16])((long)src + 0x30))[9];
      auVar131._9_7_ = 0;
      auVar130._10_6_ = 0;
      auVar130._0_10_ = SUB1610(auVar131 << 0x38,6);
      auVar129._11_5_ = 0;
      auVar129._0_11_ = SUB1611(auVar130 << 0x30,5);
      auVar128._12_4_ = 0;
      auVar128._0_12_ = SUB1612(auVar129 << 0x28,4);
      auVar127._13_3_ = 0;
      auVar127._0_13_ = SUB1613(auVar128 << 0x20,3);
      auVar175._14_2_ = 0;
      auVar175._0_14_ = SUB1614(auVar127 << 0x18,2);
      auVar175 = auVar175 << 0x10;
      auVar280._0_14_ = auVar237._0_14_;
      auVar280[0xe] = (*(undefined1 (*) [16])((long)src + 0x10))[9];
      auVar280[0xf] = (*(undefined1 (*) [16])((long)src + 0x10))[0xd];
      auVar279._14_2_ = auVar280._14_2_;
      auVar279._0_13_ = auVar237._0_13_;
      auVar279[0xd] = cVar35;
      auVar278._13_3_ = auVar279._13_3_;
      auVar278._0_12_ = auVar237._0_12_;
      auVar278[0xc] = (*(undefined1 (*) [16])((long)src + 0x10))[1];
      auVar277._12_4_ = auVar278._12_4_;
      auVar277._0_11_ = auVar237._0_11_;
      auVar277[0xb] = auVar222[0xd];
      auVar276._11_5_ = auVar277._11_5_;
      auVar276._0_10_ = auVar237._0_10_;
      auVar276[10] = auVar222[9];
      auVar275._10_6_ = auVar276._10_6_;
      auVar275._0_9_ = auVar237._0_9_;
      auVar275[9] = cVar407;
      auVar274._9_7_ = auVar275._9_7_;
      auVar274._0_8_ = auVar237._0_8_;
      auVar274[8] = auVar222[1];
      Var134 = CONCAT91(CONCAT81(auVar274._8_8_,(*(undefined1 (*) [16])((long)src + 0x10))[0xc]),
                        (*(undefined1 (*) [16])((long)src + 0x10))[8]);
      auVar133._2_10_ = Var134;
      auVar133[1] = cVar43;
      auVar133[0] = (*(undefined1 (*) [16])((long)src + 0x10))[0];
      auVar132._2_12_ = auVar133;
      auVar132[1] = auVar222[0xc];
      auVar132[0] = auVar222[8];
      auVar273[1] = bVar404;
      auVar273[0] = auVar222[0];
      auVar273._2_14_ = auVar132;
      uVar205 = CONCAT13(auVar222[0xe],CONCAT12(auVar222[10],CONCAT11(bVar409,auVar222[2])));
      uVar206 = CONCAT15(cVar28,CONCAT14((*(undefined1 (*) [16])((long)src + 0x10))[2],uVar205));
      auVar245._0_8_ =
           CONCAT17((*(undefined1 (*) [16])((long)src + 0x10))[0xe],
                    CONCAT16((*(undefined1 (*) [16])((long)src + 0x10))[10],uVar206));
      auVar363._0_14_ = auVar175._0_14_;
      auVar363[0xe] = (*(undefined1 (*) [16])((long)src + 0x30))[9];
      auVar363[0xf] = (*(undefined1 (*) [16])((long)src + 0x30))[0xd];
      auVar362._14_2_ = auVar363._14_2_;
      auVar362._0_13_ = auVar175._0_13_;
      auVar362[0xd] = cVar36;
      auVar361._13_3_ = auVar362._13_3_;
      auVar361._0_12_ = auVar175._0_12_;
      auVar361[0xc] = (*(undefined1 (*) [16])((long)src + 0x30))[1];
      auVar360._12_4_ = auVar361._12_4_;
      auVar360._0_11_ = auVar175._0_11_;
      auVar360[0xb] = auVar339[0xd];
      auVar359._11_5_ = auVar360._11_5_;
      auVar359._0_10_ = auVar175._0_10_;
      auVar359[10] = auVar339[9];
      auVar358._10_6_ = auVar359._10_6_;
      auVar358._0_9_ = auVar175._0_9_;
      auVar358[9] = cVar427;
      auVar357._9_7_ = auVar358._9_7_;
      auVar357._0_8_ = auVar175._0_8_;
      auVar357[8] = auVar339[1];
      Var137 = CONCAT91(CONCAT81(auVar357._8_8_,(*(undefined1 (*) [16])((long)src + 0x30))[0xc]),
                        (*(undefined1 (*) [16])((long)src + 0x30))[8]);
      auVar136._2_10_ = Var137;
      auVar136[1] = cVar42;
      auVar136[0] = (*(undefined1 (*) [16])((long)src + 0x30))[0];
      auVar135._2_12_ = auVar136;
      auVar135[1] = auVar339[0xc];
      auVar135[0] = auVar339[8];
      auVar356[1] = bVar426;
      auVar356[0] = auVar339[0];
      auVar356._2_14_ = auVar135;
      uVar166 = CONCAT13(auVar339[0xe],CONCAT12(auVar339[10],CONCAT11(bVar428,auVar339[2])));
      uVar167 = CONCAT15(cVar33,CONCAT14((*(undefined1 (*) [16])((long)src + 0x30))[2],uVar166));
      uVar168 = CONCAT17((*(undefined1 (*) [16])((long)src + 0x30))[0xe],
                         CONCAT16((*(undefined1 (*) [16])((long)src + 0x30))[10],uVar167));
      auVar245._8_8_ = uVar168;
      auVar372._8_8_ = auVar357._8_8_;
      auVar372._0_8_ = auVar274._8_8_;
      auVar203._0_8_ = auVar273._0_8_;
      auVar203._8_8_ = auVar356._0_8_;
      auVar371._0_14_ = auVar313._0_14_;
      auVar371[0xe] = auVar313[7];
      auVar371[0xf] = (*(undefined1 (*) [16])((long)src + 0x50))[7];
      auVar370._14_2_ = auVar371._14_2_;
      auVar370._0_13_ = auVar313._0_13_;
      auVar370[0xd] = cVar32;
      bVar377 = auVar313[6];
      auVar369._13_3_ = auVar370._13_3_;
      auVar369._0_12_ = auVar313._0_12_;
      auVar369[0xc] = bVar377;
      auVar368._12_4_ = auVar369._12_4_;
      auVar368._0_11_ = auVar313._0_11_;
      auVar368[0xb] = cVar37;
      cVar376 = auVar313[5];
      auVar367._11_5_ = auVar368._11_5_;
      auVar367._0_10_ = auVar313._0_10_;
      auVar367[10] = cVar376;
      auVar366._10_6_ = auVar367._10_6_;
      auVar366._0_9_ = auVar313._0_9_;
      auVar366[9] = cVar41;
      bVar375 = auVar313[4];
      auVar365._9_7_ = auVar366._9_7_;
      auVar365._0_8_ = auVar313._0_8_;
      auVar365[8] = bVar375;
      auVar142._1_8_ = auVar365._8_8_;
      auVar142[0] = (*(undefined1 (*) [16])((long)src + 0x50))[3];
      auVar142._9_7_ = 0;
      auVar141._10_6_ = 0;
      auVar141._0_10_ = SUB1610(auVar142 << 0x38,6);
      auVar140._11_5_ = 0;
      auVar140._0_11_ = SUB1611(auVar141 << 0x30,5);
      auVar139._12_4_ = 0;
      auVar139._0_12_ = SUB1612(auVar140 << 0x28,4);
      auVar138._13_3_ = 0;
      auVar138._0_13_ = SUB1613(auVar139 << 0x20,3);
      auVar364._14_2_ = 0;
      auVar364._0_14_ = SUB1614(auVar138 << 0x18,2);
      auVar364 = auVar364 << 0x10;
      auVar400._0_14_ = auVar282._0_14_;
      auVar400[0xe] = auVar282[7];
      auVar400[0xf] = (*(undefined1 (*) [16])((long)src + 0x70))[7];
      auVar399._14_2_ = auVar400._14_2_;
      auVar399._0_13_ = auVar282._0_13_;
      auVar399[0xd] = cVar34;
      bVar410 = auVar282[6];
      auVar398._13_3_ = auVar399._13_3_;
      auVar398._0_12_ = auVar282._0_12_;
      auVar398[0xc] = bVar410;
      auVar397._12_4_ = auVar398._12_4_;
      auVar397._0_11_ = auVar282._0_11_;
      auVar397[0xb] = cVar38;
      cVar408 = auVar282[5];
      auVar396._11_5_ = auVar397._11_5_;
      auVar396._0_10_ = auVar282._0_10_;
      auVar396[10] = cVar408;
      auVar395._10_6_ = auVar396._10_6_;
      auVar395._0_9_ = auVar282._0_9_;
      auVar395[9] = cVar49;
      bVar405 = auVar282[4];
      auVar394._9_7_ = auVar395._9_7_;
      auVar394._0_8_ = auVar282._0_8_;
      auVar394[8] = bVar405;
      auVar147._1_8_ = auVar394._8_8_;
      auVar147[0] = (*(undefined1 (*) [16])((long)src + 0x70))[3];
      auVar147._9_7_ = 0;
      auVar146._10_6_ = 0;
      auVar146._0_10_ = SUB1610(auVar147 << 0x38,6);
      auVar145._11_5_ = 0;
      auVar145._0_11_ = SUB1611(auVar146 << 0x30,5);
      auVar144._12_4_ = 0;
      auVar144._0_12_ = SUB1612(auVar145 << 0x28,4);
      auVar143._13_3_ = 0;
      auVar143._0_13_ = SUB1613(auVar144 << 0x20,3);
      auVar393._14_2_ = 0;
      auVar393._0_14_ = SUB1614(auVar143 << 0x18,2);
      auVar393 = auVar393 << 0x10;
      auVar337._0_14_ = auVar364._0_14_;
      auVar337[0xe] = (*(undefined1 (*) [16])((long)src + 0x50))[3];
      auVar337[0xf] = (*(undefined1 (*) [16])((long)src + 0x50))[0xb];
      auVar336._14_2_ = auVar337._14_2_;
      auVar336._0_13_ = auVar364._0_13_;
      auVar336[0xd] = auVar313[0xb];
      auVar335._13_3_ = auVar336._13_3_;
      auVar335._0_12_ = auVar364._0_12_;
      auVar335[0xc] = auVar313[3];
      auVar334._12_4_ = auVar335._12_4_;
      auVar334._0_11_ = auVar364._0_11_;
      auVar334[0xb] = (*(undefined1 (*) [16])((long)src + 0x50))[10];
      auVar333._11_5_ = auVar334._11_5_;
      auVar333._0_10_ = auVar364._0_10_;
      auVar333[10] = (*(undefined1 (*) [16])((long)src + 0x50))[2];
      auVar332._10_6_ = auVar333._10_6_;
      auVar332._0_9_ = auVar364._0_9_;
      auVar332[9] = auVar313[10];
      auVar331._9_7_ = auVar332._9_7_;
      auVar331._0_8_ = auVar364._0_8_;
      auVar331[8] = auVar313[2];
      auVar152._1_8_ = auVar331._8_8_;
      auVar152[0] = (*(undefined1 (*) [16])((long)src + 0x50))[9];
      auVar152._9_7_ = 0;
      auVar151._10_6_ = 0;
      auVar151._0_10_ = SUB1610(auVar152 << 0x38,6);
      auVar150._11_5_ = 0;
      auVar150._0_11_ = SUB1611(auVar151 << 0x30,5);
      auVar149._12_4_ = 0;
      auVar149._0_12_ = SUB1612(auVar150 << 0x28,4);
      auVar148._13_3_ = 0;
      auVar148._0_13_ = SUB1613(auVar149 << 0x20,3);
      auVar330._14_2_ = 0;
      auVar330._0_14_ = SUB1614(auVar148 << 0x18,2);
      auVar330 = auVar330 << 0x10;
      auVar309._0_14_ = auVar393._0_14_;
      auVar309[0xe] = (*(undefined1 (*) [16])((long)src + 0x70))[3];
      auVar309[0xf] = (*(undefined1 (*) [16])((long)src + 0x70))[0xb];
      auVar308._14_2_ = auVar309._14_2_;
      auVar308._0_13_ = auVar393._0_13_;
      auVar308[0xd] = auVar282[0xb];
      auVar307._13_3_ = auVar308._13_3_;
      auVar307._0_12_ = auVar393._0_12_;
      auVar307[0xc] = auVar282[3];
      auVar306._12_4_ = auVar307._12_4_;
      auVar306._0_11_ = auVar393._0_11_;
      auVar306[0xb] = (*(undefined1 (*) [16])((long)src + 0x70))[10];
      auVar305._11_5_ = auVar306._11_5_;
      auVar305._0_10_ = auVar393._0_10_;
      auVar305[10] = (*(undefined1 (*) [16])((long)src + 0x70))[2];
      auVar304._10_6_ = auVar305._10_6_;
      auVar304._0_9_ = auVar393._0_9_;
      auVar304[9] = auVar282[10];
      auVar303._9_7_ = auVar304._9_7_;
      auVar303._0_8_ = auVar393._0_8_;
      auVar303[8] = auVar282[2];
      auVar157._1_8_ = auVar303._8_8_;
      auVar157[0] = (*(undefined1 (*) [16])((long)src + 0x70))[9];
      auVar157._9_7_ = 0;
      auVar156._10_6_ = 0;
      auVar156._0_10_ = SUB1610(auVar157 << 0x38,6);
      auVar155._11_5_ = 0;
      auVar155._0_11_ = SUB1611(auVar156 << 0x30,5);
      auVar154._12_4_ = 0;
      auVar154._0_12_ = SUB1612(auVar155 << 0x28,4);
      auVar153._13_3_ = 0;
      auVar153._0_13_ = SUB1613(auVar154 << 0x20,3);
      auVar302._14_2_ = 0;
      auVar302._0_14_ = SUB1614(auVar153 << 0x18,2);
      auVar302 = auVar302 << 0x10;
      auVar221._0_14_ = auVar330._0_14_;
      auVar221[0xe] = (*(undefined1 (*) [16])((long)src + 0x50))[9];
      auVar221[0xf] = (*(undefined1 (*) [16])((long)src + 0x50))[0xd];
      auVar220._14_2_ = auVar221._14_2_;
      auVar220._0_13_ = auVar330._0_13_;
      auVar220[0xd] = cVar37;
      auVar219._13_3_ = auVar220._13_3_;
      auVar219._0_12_ = auVar330._0_12_;
      auVar219[0xc] = (*(undefined1 (*) [16])((long)src + 0x50))[1];
      auVar218._12_4_ = auVar219._12_4_;
      auVar218._0_11_ = auVar330._0_11_;
      auVar218[0xb] = auVar313[0xd];
      auVar217._11_5_ = auVar218._11_5_;
      auVar217._0_10_ = auVar330._0_10_;
      auVar217[10] = auVar313[9];
      auVar216._10_6_ = auVar217._10_6_;
      auVar216._0_9_ = auVar330._0_9_;
      auVar216[9] = cVar376;
      auVar215._9_7_ = auVar216._9_7_;
      auVar215._0_8_ = auVar330._0_8_;
      auVar215[8] = auVar313[1];
      Var160 = CONCAT91(CONCAT81(auVar215._8_8_,(*(undefined1 (*) [16])((long)src + 0x50))[0xc]),
                        (*(undefined1 (*) [16])((long)src + 0x50))[8]);
      auVar159._2_10_ = Var160;
      auVar159[1] = cVar41;
      auVar159[0] = (*(undefined1 (*) [16])((long)src + 0x50))[0];
      auVar158._2_12_ = auVar159;
      auVar158[1] = auVar313[0xc];
      auVar158[0] = auVar313[8];
      auVar214[1] = bVar375;
      auVar214[0] = auVar313[0];
      auVar214._2_14_ = auVar158;
      uVar264 = CONCAT13(auVar313[0xe],CONCAT12(auVar313[10],CONCAT11(bVar377,auVar313[2])));
      uVar265 = CONCAT15(cVar32,CONCAT14((*(undefined1 (*) [16])((long)src + 0x50))[2],uVar264));
      auVar338._0_8_ =
           CONCAT17((*(undefined1 (*) [16])((long)src + 0x50))[0xe],
                    CONCAT16((*(undefined1 (*) [16])((long)src + 0x50))[10],uVar265));
      auVar200._0_14_ = auVar302._0_14_;
      auVar200[0xe] = (*(undefined1 (*) [16])((long)src + 0x70))[9];
      auVar200[0xf] = (*(undefined1 (*) [16])((long)src + 0x70))[0xd];
      auVar199._14_2_ = auVar200._14_2_;
      auVar199._0_13_ = auVar302._0_13_;
      auVar199[0xd] = cVar38;
      auVar198._13_3_ = auVar199._13_3_;
      auVar198._0_12_ = auVar302._0_12_;
      auVar198[0xc] = (*(undefined1 (*) [16])((long)src + 0x70))[1];
      auVar197._12_4_ = auVar198._12_4_;
      auVar197._0_11_ = auVar302._0_11_;
      auVar197[0xb] = auVar282[0xd];
      auVar196._11_5_ = auVar197._11_5_;
      auVar196._0_10_ = auVar302._0_10_;
      auVar196[10] = auVar282[9];
      auVar195._10_6_ = auVar196._10_6_;
      auVar195._0_9_ = auVar302._0_9_;
      auVar195[9] = cVar408;
      auVar194._9_7_ = auVar195._9_7_;
      auVar194._0_8_ = auVar302._0_8_;
      auVar194[8] = auVar282[1];
      Var163 = CONCAT91(CONCAT81(auVar194._8_8_,(*(undefined1 (*) [16])((long)src + 0x70))[0xc]),
                        (*(undefined1 (*) [16])((long)src + 0x70))[8]);
      auVar162._2_10_ = Var163;
      auVar162[1] = cVar49;
      auVar162[0] = (*(undefined1 (*) [16])((long)src + 0x70))[0];
      auVar161._2_12_ = auVar162;
      auVar161[1] = auVar282[0xc];
      auVar161[0] = auVar282[8];
      auVar193[1] = bVar405;
      auVar193[0] = auVar282[0];
      auVar193._2_14_ = auVar161;
      uVar228 = CONCAT13(auVar282[0xe],CONCAT12(auVar282[10],CONCAT11(bVar410,auVar282[2])));
      uVar229 = CONCAT15(cVar34,CONCAT14((*(undefined1 (*) [16])((long)src + 0x70))[2],uVar228));
      uVar207 = CONCAT17((*(undefined1 (*) [16])((long)src + 0x70))[0xe],
                         CONCAT16((*(undefined1 (*) [16])((long)src + 0x70))[10],uVar229));
      auVar338._8_8_ = uVar207;
      auVar202._8_8_ = auVar194._8_8_;
      auVar202._0_8_ = auVar215._8_8_;
      auVar424._0_8_ = auVar214._0_8_;
      auVar424._8_8_ = auVar193._0_8_;
      auVar310 = auVar245 & auVar164;
      auVar201 = auVar338 & auVar164;
      sVar66 = auVar310._0_2_;
      sVar67 = auVar310._2_2_;
      bVar2 = (0 < sVar67) * (sVar67 < 0x100) * auVar310[2] - (0xff < sVar67);
      sVar67 = auVar310._4_2_;
      sVar74 = auVar310._6_2_;
      cVar3 = (0 < sVar74) * (sVar74 < 0x100) * auVar310[6] - (0xff < sVar74);
      uVar293 = CONCAT13(cVar3,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar310[4] -
                                        (0xff < sVar67),
                                        CONCAT11(bVar2,(0 < sVar66) * (sVar66 < 0x100) * auVar310[0]
                                                       - (0xff < sVar66))));
      sVar66 = auVar310._8_2_;
      sVar67 = auVar310._10_2_;
      cVar4 = (0 < sVar67) * (sVar67 < 0x100) * auVar310[10] - (0xff < sVar67);
      uVar294 = CONCAT15(cVar4,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar310[8] -
                                        (0xff < sVar66),uVar293));
      sVar66 = auVar310._12_2_;
      sVar67 = auVar310._14_2_;
      cVar5 = (0 < sVar67) * (sVar67 < 0x100) * auVar310[0xe] - (0xff < sVar67);
      uVar295 = CONCAT17(cVar5,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar310[0xc] -
                                        (0xff < sVar66),uVar294));
      sVar66 = auVar201._0_2_;
      sVar67 = auVar201._2_2_;
      cVar6 = (0 < sVar67) * (sVar67 < 0x100) * auVar201[2] - (0xff < sVar67);
      auVar296._0_10_ =
           CONCAT19(cVar6,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar201[0] - (0xff < sVar66),
                                   uVar295));
      sVar66 = auVar201._4_2_;
      auVar296[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar201[4] - (0xff < sVar66);
      sVar66 = auVar201._6_2_;
      cVar7 = (0 < sVar66) * (sVar66 < 0x100) * auVar201[6] - (0xff < sVar66);
      auVar296[0xb] = cVar7;
      sVar66 = auVar201._8_2_;
      auVar299[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar201[8] - (0xff < sVar66);
      auVar299._0_12_ = auVar296;
      sVar66 = auVar201._10_2_;
      cVar8 = (0 < sVar66) * (sVar66 < 0x100) * auVar201[10] - (0xff < sVar66);
      auVar299[0xd] = cVar8;
      sVar66 = auVar201._12_2_;
      auVar311[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar201[0xc] - (0xff < sVar66);
      auVar311._0_14_ = auVar299;
      sVar66 = auVar201._14_2_;
      cVar9 = (0 < sVar66) * (sVar66 < 0x100) * auVar201[0xe] - (0xff < sVar66);
      auVar311[0xf] = cVar9;
      auVar372 = auVar372 & auVar164;
      auVar202 = auVar202 & auVar164;
      sVar66 = auVar372._0_2_;
      sVar67 = auVar372._2_2_;
      bVar10 = (0 < sVar67) * (sVar67 < 0x100) * auVar372[2] - (0xff < sVar67);
      sVar67 = auVar372._4_2_;
      sVar74 = auVar372._6_2_;
      cVar11 = (0 < sVar74) * (sVar74 < 0x100) * auVar372[6] - (0xff < sVar74);
      uVar349 = CONCAT13(cVar11,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar372[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar10,(0 < sVar66) * (sVar66 < 0x100) *
                                                         auVar372[0] - (0xff < sVar66))));
      sVar66 = auVar372._8_2_;
      sVar67 = auVar372._10_2_;
      cVar12 = (0 < sVar67) * (sVar67 < 0x100) * auVar372[10] - (0xff < sVar67);
      uVar350 = CONCAT15(cVar12,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar372[8] -
                                         (0xff < sVar66),uVar349));
      sVar66 = auVar372._12_2_;
      sVar67 = auVar372._14_2_;
      cVar13 = (0 < sVar67) * (sVar67 < 0x100) * auVar372[0xe] - (0xff < sVar67);
      uVar351 = CONCAT17(cVar13,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar372[0xc] -
                                         (0xff < sVar66),uVar350));
      sVar66 = auVar202._0_2_;
      sVar67 = auVar202._2_2_;
      cVar14 = (0 < sVar67) * (sVar67 < 0x100) * auVar202[2] - (0xff < sVar67);
      auVar352._0_10_ =
           CONCAT19(cVar14,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar202[0] - (0xff < sVar66),
                                    uVar351));
      sVar66 = auVar202._4_2_;
      auVar352[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar202[4] - (0xff < sVar66);
      sVar66 = auVar202._6_2_;
      cVar15 = (0 < sVar66) * (sVar66 < 0x100) * auVar202[6] - (0xff < sVar66);
      auVar352[0xb] = cVar15;
      sVar66 = auVar202._8_2_;
      auVar354[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar202[8] - (0xff < sVar66);
      auVar354._0_12_ = auVar352;
      sVar66 = auVar202._10_2_;
      cVar16 = (0 < sVar66) * (sVar66 < 0x100) * auVar202[10] - (0xff < sVar66);
      auVar354[0xd] = cVar16;
      sVar66 = auVar202._12_2_;
      auVar373[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar202[0xc] - (0xff < sVar66);
      auVar373._0_14_ = auVar354;
      sVar66 = auVar202._14_2_;
      cVar17 = (0 < sVar66) * (sVar66 < 0x100) * auVar202[0xe] - (0xff < sVar66);
      auVar373[0xf] = cVar17;
      auVar203 = auVar203 & auVar164;
      auVar424 = auVar424 & auVar164;
      sVar66 = auVar203._0_2_;
      sVar67 = auVar203._2_2_;
      bVar18 = (0 < sVar67) * (sVar67 < 0x100) * auVar203[2] - (0xff < sVar67);
      sVar67 = auVar203._4_2_;
      sVar74 = auVar203._6_2_;
      cVar19 = (0 < sVar74) * (sVar74 < 0x100) * auVar203[6] - (0xff < sVar74);
      uVar184 = CONCAT13(cVar19,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar203[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar18,(0 < sVar66) * (sVar66 < 0x100) *
                                                         auVar203[0] - (0xff < sVar66))));
      sVar66 = auVar203._8_2_;
      sVar67 = auVar203._10_2_;
      cVar20 = (0 < sVar67) * (sVar67 < 0x100) * auVar203[10] - (0xff < sVar67);
      uVar185 = CONCAT15(cVar20,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar203[8] -
                                         (0xff < sVar66),uVar184));
      sVar66 = auVar203._12_2_;
      sVar67 = auVar203._14_2_;
      cVar21 = (0 < sVar67) * (sVar67 < 0x100) * auVar203[0xe] - (0xff < sVar67);
      uVar186 = CONCAT17(cVar21,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar203[0xc] -
                                         (0xff < sVar66),uVar185));
      sVar66 = auVar424._0_2_;
      sVar67 = auVar424._2_2_;
      cVar22 = (0 < sVar67) * (sVar67 < 0x100) * auVar424[2] - (0xff < sVar67);
      auVar187._0_10_ =
           CONCAT19(cVar22,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar424[0] - (0xff < sVar66),
                                    uVar186));
      sVar66 = auVar424._4_2_;
      auVar187[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar424[4] - (0xff < sVar66);
      sVar66 = auVar424._6_2_;
      cVar23 = (0 < sVar66) * (sVar66 < 0x100) * auVar424[6] - (0xff < sVar66);
      auVar187[0xb] = cVar23;
      sVar66 = auVar424._8_2_;
      auVar190[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar424[8] - (0xff < sVar66);
      auVar190._0_12_ = auVar187;
      sVar66 = auVar424._10_2_;
      cVar24 = (0 < sVar66) * (sVar66 < 0x100) * auVar424[10] - (0xff < sVar66);
      auVar190[0xd] = cVar24;
      sVar66 = auVar424._12_2_;
      auVar204[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar424[0xc] - (0xff < sVar66);
      auVar204._0_14_ = auVar190;
      sVar66 = auVar424._14_2_;
      cVar25 = (0 < sVar66) * (sVar66 < 0x100) * auVar424[0xe] - (0xff < sVar66);
      auVar204[0xf] = cVar25;
      uVar226 = (ushort)bVar409;
      uVar249 = (ushort)((uint)uVar205 >> 0x18);
      uVar251 = (ushort)((uint6)uVar206 >> 0x28);
      uVar253 = (ushort)((ulong)auVar245._0_8_ >> 0x38);
      uVar255 = (ushort)bVar428;
      uVar257 = (ushort)((uint)uVar166 >> 0x18);
      uVar259 = (ushort)((uint6)uVar167 >> 0x28);
      uVar261 = (ushort)((ulong)uVar168 >> 0x38);
      uVar322 = (ushort)bVar377;
      uVar342 = (ushort)((uint)uVar264 >> 0x18);
      uVar343 = (ushort)((uint6)uVar265 >> 0x28);
      uVar344 = (ushort)((ulong)auVar338._0_8_ >> 0x38);
      uVar345 = (ushort)bVar410;
      uVar346 = (ushort)((uint)uVar228 >> 0x18);
      uVar347 = (ushort)((uint6)uVar229 >> 0x28);
      uVar348 = (ushort)((ulong)uVar207 >> 0x38);
      bVar26 = (uVar249 != 0) * (uVar249 < 0x100) * auVar222[0xe] - (0xff < uVar249);
      cVar27 = (uVar253 != 0) * (uVar253 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x10))[0xe]
               - (0xff < uVar253);
      uVar228 = CONCAT13(cVar27,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar28 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar26,(uVar226 != 0) * (uVar226 < 0x100) *
                                                         bVar409 - (0xff < uVar226))));
      cVar28 = (uVar257 != 0) * (uVar257 < 0x100) * auVar339[0xe] - (0xff < uVar257);
      uVar229 = CONCAT15(cVar28,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * bVar428 -
                                         (0xff < uVar255),uVar228));
      cVar29 = (uVar261 != 0) * (uVar261 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x30))[0xe]
               - (0xff < uVar261);
      uVar230 = CONCAT17(cVar29,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar33 -
                                         (0xff < uVar259),uVar229));
      cVar30 = (uVar342 != 0) * (uVar342 < 0x100) * auVar313[0xe] - (0xff < uVar342);
      auVar231._0_10_ =
           CONCAT19(cVar30,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar377 - (0xff < uVar322),
                                    uVar230));
      auVar231[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar32 - (0xff < uVar343);
      cVar31 = (uVar344 != 0) * (uVar344 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x50))[0xe]
               - (0xff < uVar344);
      auVar231[0xb] = cVar31;
      auVar234[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * bVar410 - (0xff < uVar345);
      auVar234._0_12_ = auVar231;
      cVar32 = (uVar346 != 0) * (uVar346 < 0x100) * auVar282[0xe] - (0xff < uVar346);
      auVar234[0xd] = cVar32;
      auVar246[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar34 - (0xff < uVar347);
      auVar246._0_14_ = auVar234;
      cVar33 = (uVar348 != 0) * (uVar348 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x70))[0xe]
               - (0xff < uVar348);
      auVar246[0xf] = cVar33;
      uVar226 = auVar274._8_2_ >> 8;
      uVar249 = auVar276._10_2_ >> 8;
      uVar251 = auVar278._12_2_ >> 8;
      uVar253 = auVar279._14_2_ >> 8;
      uVar255 = auVar357._8_2_ >> 8;
      uVar257 = auVar359._10_2_ >> 8;
      uVar259 = auVar361._12_2_ >> 8;
      uVar261 = auVar362._14_2_ >> 8;
      uVar322 = auVar215._8_2_ >> 8;
      uVar342 = auVar217._10_2_ >> 8;
      uVar343 = auVar219._12_2_ >> 8;
      uVar344 = auVar220._14_2_ >> 8;
      uVar345 = auVar194._8_2_ >> 8;
      uVar346 = auVar196._10_2_ >> 8;
      uVar347 = auVar198._12_2_ >> 8;
      uVar348 = auVar199._14_2_ >> 8;
      bVar377 = (uVar249 != 0) * (uVar249 < 0x100) * auVar222[0xd] - (0xff < uVar249);
      cVar34 = (uVar253 != 0) * (uVar253 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x10))[0xd]
               - (0xff < uVar253);
      uVar166 = CONCAT13(cVar34,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar35 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar377,(uVar226 != 0) * (uVar226 < 0x100) *
                                                          cVar407 - (0xff < uVar226))));
      cVar35 = (uVar257 != 0) * (uVar257 < 0x100) * auVar339[0xd] - (0xff < uVar257);
      uVar167 = CONCAT15(cVar35,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar427 -
                                         (0xff < uVar255),uVar166));
      cVar407 = (uVar261 != 0) * (uVar261 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x30))[0xd]
                - (0xff < uVar261);
      uVar168 = CONCAT17(cVar407,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar36 -
                                          (0xff < uVar259),uVar167));
      cVar36 = (uVar342 != 0) * (uVar342 < 0x100) * auVar313[0xd] - (0xff < uVar342);
      auVar169._0_10_ =
           CONCAT19(cVar36,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * cVar376 - (0xff < uVar322),
                                    uVar168));
      auVar169[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar37 - (0xff < uVar343);
      cVar37 = (uVar344 != 0) * (uVar344 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x50))[0xd]
               - (0xff < uVar344);
      auVar169[0xb] = cVar37;
      auVar172[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar408 - (0xff < uVar345);
      auVar172._0_12_ = auVar169;
      cVar376 = (uVar346 != 0) * (uVar346 < 0x100) * auVar282[0xd] - (0xff < uVar346);
      auVar172[0xd] = cVar376;
      auVar183[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar38 - (0xff < uVar347);
      auVar183._0_14_ = auVar172;
      cVar38 = (uVar348 != 0) * (uVar348 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x70))[0xd]
               - (0xff < uVar348);
      auVar183[0xf] = cVar38;
      uVar259 = auVar132._0_2_ >> 8;
      uVar261 = auVar133._0_2_ >> 8;
      uVar322 = (ushort)Var134 >> 8;
      uVar342 = auVar135._0_2_ >> 8;
      uVar343 = auVar136._0_2_ >> 8;
      uVar344 = (ushort)Var137 >> 8;
      uVar226 = auVar158._0_2_ >> 8;
      uVar249 = auVar159._0_2_ >> 8;
      uVar251 = (ushort)Var160 >> 8;
      uVar253 = auVar161._0_2_ >> 8;
      uVar255 = auVar162._0_2_ >> 8;
      uVar257 = (ushort)Var163 >> 8;
      bVar409 = (uVar259 != 0) * (uVar259 < 0x100) * auVar222[0xc] - (0xff < uVar259);
      cVar408 = (uVar322 != 0) * (uVar322 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x10))[0xc]
                - (0xff < uVar322);
      uVar264 = CONCAT13(cVar408,CONCAT12((uVar261 != 0) * (uVar261 < 0x100) * cVar43 -
                                          (0xff < uVar261),
                                          CONCAT11(bVar409,(bVar404 != 0) * (bVar404 < 0x100) *
                                                           bVar404 - (0xff < bVar404))));
      cVar39 = (uVar342 != 0) * (uVar342 < 0x100) * auVar339[0xc] - (0xff < uVar342);
      uVar265 = CONCAT15(cVar39,CONCAT14((bVar426 != 0) * (bVar426 < 0x100) * bVar426 -
                                         (0xff < bVar426),uVar264));
      cVar40 = (uVar344 != 0) * (uVar344 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x30))[0xc]
               - (0xff < uVar344);
      uVar266 = CONCAT17(cVar40,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar42 -
                                         (0xff < uVar343),uVar265));
      cVar427 = (uVar226 != 0) * (uVar226 < 0x100) * auVar313[0xc] - (0xff < uVar226);
      auVar267._0_10_ =
           CONCAT19(cVar427,CONCAT18((bVar375 != 0) * (bVar375 < 0x100) * bVar375 - (0xff < bVar375)
                                     ,uVar266));
      auVar267[10] = (uVar249 != 0) * (uVar249 < 0x100) * cVar41 - (0xff < uVar249);
      cVar41 = (uVar251 != 0) * (uVar251 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x50))[0xc]
               - (0xff < uVar251);
      auVar267[0xb] = cVar41;
      auVar270[0xc] = (bVar405 != 0) * (bVar405 < 0x100) * bVar405 - (0xff < bVar405);
      auVar270._0_12_ = auVar267;
      cVar42 = (uVar253 != 0) * (uVar253 < 0x100) * auVar282[0xc] - (0xff < uVar253);
      auVar270[0xd] = cVar42;
      auVar281[0xe] = (uVar255 != 0) * (uVar255 < 0x100) * cVar49 - (0xff < uVar255);
      auVar281._0_14_ = auVar270;
      cVar43 = (uVar257 != 0) * (uVar257 < 0x100) * (*(undefined1 (*) [16])((long)src + 0x70))[0xc]
               - (0xff < uVar257);
      auVar281[0xf] = cVar43;
      auVar339 = auVar311 & auVar164;
      auVar222 = auVar373 & auVar164;
      sVar66 = auVar339._0_2_;
      sVar67 = auVar339._2_2_;
      bVar375 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[2] - (0xff < sVar67);
      sVar67 = auVar339._4_2_;
      sVar74 = auVar339._6_2_;
      cVar44 = (0 < sVar74) * (sVar74 < 0x100) * auVar339[6] - (0xff < sVar74);
      uVar323 = CONCAT13(cVar44,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar339[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar375,(0 < sVar66) * (sVar66 < 0x100) *
                                                          auVar339[0] - (0xff < sVar66))));
      sVar66 = auVar339._8_2_;
      sVar67 = auVar339._10_2_;
      cVar45 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[10] - (0xff < sVar67);
      uVar324 = CONCAT15(cVar45,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar339[8] -
                                         (0xff < sVar66),uVar323));
      sVar66 = auVar339._12_2_;
      sVar67 = auVar339._14_2_;
      cVar46 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[0xe] - (0xff < sVar67);
      uVar325 = CONCAT17(cVar46,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar339[0xc] -
                                         (0xff < sVar66),uVar324));
      sVar66 = auVar222._0_2_;
      sVar67 = auVar222._2_2_;
      cVar47 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[2] - (0xff < sVar67);
      auVar326._0_10_ =
           CONCAT19(cVar47,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar222[0] - (0xff < sVar66),
                                    uVar325));
      sVar66 = auVar222._4_2_;
      auVar326[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[4] - (0xff < sVar66);
      sVar66 = auVar222._6_2_;
      cVar48 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[6] - (0xff < sVar66);
      auVar326[0xb] = cVar48;
      sVar66 = auVar222._8_2_;
      auVar328[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[8] - (0xff < sVar66);
      auVar328._0_12_ = auVar326;
      sVar66 = auVar222._10_2_;
      cVar49 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[10] - (0xff < sVar66);
      auVar328[0xd] = cVar49;
      sVar66 = auVar222._12_2_;
      auVar340[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0xc] - (0xff < sVar66);
      auVar340._0_14_ = auVar328;
      sVar66 = auVar222._14_2_;
      cVar50 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0xe] - (0xff < sVar66);
      auVar340[0xf] = cVar50;
      auVar339 = auVar204 & auVar164;
      auVar222 = auVar246 & auVar164;
      sVar66 = auVar339._0_2_;
      sVar67 = auVar339._2_2_;
      bVar404 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[2] - (0xff < sVar67);
      sVar67 = auVar339._4_2_;
      sVar74 = auVar339._6_2_;
      cVar51 = (0 < sVar74) * (sVar74 < 0x100) * auVar339[6] - (0xff < sVar74);
      uVar379 = CONCAT13(cVar51,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar339[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar404,(0 < sVar66) * (sVar66 < 0x100) *
                                                          auVar339[0] - (0xff < sVar66))));
      sVar66 = auVar339._8_2_;
      sVar67 = auVar339._10_2_;
      cVar52 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[10] - (0xff < sVar67);
      uVar380 = CONCAT15(cVar52,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar339[8] -
                                         (0xff < sVar66),uVar379));
      sVar66 = auVar339._12_2_;
      sVar67 = auVar339._14_2_;
      cVar53 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[0xe] - (0xff < sVar67);
      uVar381 = CONCAT17(cVar53,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar339[0xc] -
                                         (0xff < sVar66),uVar380));
      sVar66 = auVar222._0_2_;
      sVar67 = auVar222._2_2_;
      cVar54 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[2] - (0xff < sVar67);
      auVar382._0_10_ =
           CONCAT19(cVar54,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar222[0] - (0xff < sVar66),
                                    uVar381));
      sVar66 = auVar222._4_2_;
      auVar382[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[4] - (0xff < sVar66);
      sVar66 = auVar222._6_2_;
      cVar55 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[6] - (0xff < sVar66);
      auVar382[0xb] = cVar55;
      sVar66 = auVar222._8_2_;
      auVar384[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[8] - (0xff < sVar66);
      auVar384._0_12_ = auVar382;
      sVar66 = auVar222._10_2_;
      cVar56 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[10] - (0xff < sVar66);
      auVar384[0xd] = cVar56;
      sVar66 = auVar222._12_2_;
      auVar401[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0xc] - (0xff < sVar66);
      auVar401._0_14_ = auVar384;
      sVar66 = auVar222._14_2_;
      cVar57 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0xe] - (0xff < sVar66);
      auVar401[0xf] = cVar57;
      auVar222 = auVar183 & auVar164;
      auVar339 = auVar281 & auVar164;
      sVar66 = auVar222._0_2_;
      sVar67 = auVar222._2_2_;
      bVar405 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[2] - (0xff < sVar67);
      sVar67 = auVar222._4_2_;
      sVar74 = auVar222._6_2_;
      cVar58 = (0 < sVar74) * (sVar74 < 0x100) * auVar222[6] - (0xff < sVar74);
      uVar205 = CONCAT13(cVar58,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar222[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar405,(0 < sVar66) * (sVar66 < 0x100) *
                                                          auVar222[0] - (0xff < sVar66))));
      sVar66 = auVar222._8_2_;
      sVar67 = auVar222._10_2_;
      cVar59 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[10] - (0xff < sVar67);
      uVar206 = CONCAT15(cVar59,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar222[8] -
                                         (0xff < sVar66),uVar205));
      sVar66 = auVar222._12_2_;
      sVar67 = auVar222._14_2_;
      cVar60 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[0xe] - (0xff < sVar67);
      uVar207 = CONCAT17(cVar60,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar222[0xc] -
                                         (0xff < sVar66),uVar206));
      sVar66 = auVar339._0_2_;
      sVar67 = auVar339._2_2_;
      cVar61 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[2] - (0xff < sVar67);
      auVar208._0_10_ =
           CONCAT19(cVar61,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar339[0] - (0xff < sVar66),
                                    uVar207));
      sVar66 = auVar339._4_2_;
      auVar208[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar339[4] - (0xff < sVar66);
      sVar66 = auVar339._6_2_;
      cVar62 = (0 < sVar66) * (sVar66 < 0x100) * auVar339[6] - (0xff < sVar66);
      auVar208[0xb] = cVar62;
      sVar66 = auVar339._8_2_;
      auVar211[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar339[8] - (0xff < sVar66);
      auVar211._0_12_ = auVar208;
      sVar66 = auVar339._10_2_;
      cVar63 = (0 < sVar66) * (sVar66 < 0x100) * auVar339[10] - (0xff < sVar66);
      auVar211[0xd] = cVar63;
      sVar66 = auVar339._12_2_;
      auVar223[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar339[0xc] - (0xff < sVar66);
      auVar223._0_14_ = auVar211;
      sVar66 = auVar339._14_2_;
      cVar64 = (0 < sVar66) * (sVar66 < 0x100) * auVar339[0xe] - (0xff < sVar66);
      auVar223[0xf] = cVar64;
      uVar226 = (ushort)bVar2;
      uVar249 = (ushort)((uint)uVar293 >> 0x18);
      uVar251 = (ushort)((uint6)uVar294 >> 0x28);
      uVar253 = (ushort)((ulong)uVar295 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar296._0_10_ >> 0x48);
      uVar257 = auVar296._10_2_ >> 8;
      uVar259 = auVar299._12_2_ >> 8;
      uVar261 = auVar311._14_2_ >> 8;
      uVar322 = (ushort)bVar10;
      uVar342 = (ushort)((uint)uVar349 >> 0x18);
      uVar343 = (ushort)((uint6)uVar350 >> 0x28);
      uVar344 = (ushort)((ulong)uVar351 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar352._0_10_ >> 0x48);
      uVar346 = auVar352._10_2_ >> 8;
      uVar347 = auVar354._12_2_ >> 8;
      uVar348 = auVar373._14_2_ >> 8;
      bVar410 = (uVar249 != 0) * (uVar249 < 0x100) * cVar3 - (0xff < uVar249);
      cVar5 = (uVar253 != 0) * (uVar253 < 0x100) * cVar5 - (0xff < uVar253);
      uVar293 = CONCAT13(cVar5,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar4 -
                                        (0xff < uVar251),
                                        CONCAT11(bVar410,(uVar226 != 0) * (uVar226 < 0x100) * bVar2
                                                         - (0xff < uVar226))));
      cVar4 = (uVar257 != 0) * (uVar257 < 0x100) * cVar7 - (0xff < uVar257);
      uVar294 = CONCAT15(cVar4,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar6 -
                                        (0xff < uVar255),uVar293));
      cVar6 = (uVar261 != 0) * (uVar261 < 0x100) * cVar9 - (0xff < uVar261);
      uVar295 = CONCAT17(cVar6,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar8 -
                                        (0xff < uVar259),uVar294));
      cVar7 = (uVar342 != 0) * (uVar342 < 0x100) * cVar11 - (0xff < uVar342);
      auVar297._0_10_ =
           CONCAT19(cVar7,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar10 - (0xff < uVar322),
                                   uVar295));
      auVar297[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar12 - (0xff < uVar343);
      cVar8 = (uVar344 != 0) * (uVar344 < 0x100) * cVar13 - (0xff < uVar344);
      auVar297[0xb] = cVar8;
      auVar300[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar14 - (0xff < uVar345);
      auVar300._0_12_ = auVar297;
      cVar9 = (uVar346 != 0) * (uVar346 < 0x100) * cVar15 - (0xff < uVar346);
      auVar300[0xd] = cVar9;
      auVar312[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar16 - (0xff < uVar347);
      auVar312._0_14_ = auVar300;
      cVar3 = (uVar348 != 0) * (uVar348 < 0x100) * cVar17 - (0xff < uVar348);
      auVar312[0xf] = cVar3;
      uVar226 = (ushort)bVar18;
      uVar249 = (ushort)((uint)uVar184 >> 0x18);
      uVar251 = (ushort)((uint6)uVar185 >> 0x28);
      uVar253 = (ushort)((ulong)uVar186 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar187._0_10_ >> 0x48);
      uVar257 = auVar187._10_2_ >> 8;
      uVar259 = auVar190._12_2_ >> 8;
      uVar261 = auVar204._14_2_ >> 8;
      uVar322 = (ushort)bVar26;
      uVar342 = (ushort)((uint)uVar228 >> 0x18);
      uVar343 = (ushort)((uint6)uVar229 >> 0x28);
      uVar344 = (ushort)((ulong)uVar230 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar231._0_10_ >> 0x48);
      uVar346 = auVar231._10_2_ >> 8;
      uVar347 = auVar234._12_2_ >> 8;
      uVar348 = auVar246._14_2_ >> 8;
      bVar2 = (uVar249 != 0) * (uVar249 < 0x100) * cVar19 - (0xff < uVar249);
      cVar16 = (uVar253 != 0) * (uVar253 < 0x100) * cVar21 - (0xff < uVar253);
      uVar184 = CONCAT13(cVar16,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar20 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar2,(uVar226 != 0) * (uVar226 < 0x100) * bVar18
                                                        - (0xff < uVar226))));
      cVar12 = (uVar257 != 0) * (uVar257 < 0x100) * cVar23 - (0xff < uVar257);
      uVar185 = CONCAT15(cVar12,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar22 -
                                         (0xff < uVar255),uVar184));
      cVar13 = (uVar261 != 0) * (uVar261 < 0x100) * cVar25 - (0xff < uVar261);
      uVar186 = CONCAT17(cVar13,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar24 -
                                         (0xff < uVar259),uVar185));
      cVar11 = (uVar342 != 0) * (uVar342 < 0x100) * cVar27 - (0xff < uVar342);
      auVar188._0_10_ =
           CONCAT19(cVar11,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar26 - (0xff < uVar322),
                                    uVar186));
      auVar188[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar28 - (0xff < uVar343);
      cVar14 = (uVar344 != 0) * (uVar344 < 0x100) * cVar29 - (0xff < uVar344);
      auVar188[0xb] = cVar14;
      auVar191[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar30 - (0xff < uVar345);
      auVar191._0_12_ = auVar188;
      cVar15 = (uVar346 != 0) * (uVar346 < 0x100) * cVar31 - (0xff < uVar346);
      auVar191[0xd] = cVar15;
      auVar313[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar32 - (0xff < uVar347);
      auVar313._0_14_ = auVar191;
      cVar17 = (uVar348 != 0) * (uVar348 < 0x100) * cVar33 - (0xff < uVar348);
      auVar313[0xf] = cVar17;
      uVar226 = (ushort)bVar377;
      uVar249 = (ushort)((uint)uVar166 >> 0x18);
      uVar251 = (ushort)((uint6)uVar167 >> 0x28);
      uVar253 = (ushort)((ulong)uVar168 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar169._0_10_ >> 0x48);
      uVar257 = auVar169._10_2_ >> 8;
      uVar259 = auVar172._12_2_ >> 8;
      uVar261 = auVar183._14_2_ >> 8;
      uVar322 = (ushort)bVar409;
      uVar342 = (ushort)((uint)uVar264 >> 0x18);
      uVar343 = (ushort)((uint6)uVar265 >> 0x28);
      uVar344 = (ushort)((ulong)uVar266 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar267._0_10_ >> 0x48);
      uVar346 = auVar267._10_2_ >> 8;
      uVar347 = auVar270._12_2_ >> 8;
      uVar348 = auVar281._14_2_ >> 8;
      bVar10 = (uVar249 != 0) * (uVar249 < 0x100) * cVar34 - (0xff < uVar249);
      cVar19 = (uVar253 != 0) * (uVar253 < 0x100) * cVar407 - (0xff < uVar253);
      uVar166 = CONCAT13(cVar19,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar35 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar10,(uVar226 != 0) * (uVar226 < 0x100) *
                                                         bVar377 - (0xff < uVar226))));
      cVar20 = (uVar257 != 0) * (uVar257 < 0x100) * cVar37 - (0xff < uVar257);
      uVar167 = CONCAT15(cVar20,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar36 -
                                         (0xff < uVar255),uVar166));
      cVar21 = (uVar261 != 0) * (uVar261 < 0x100) * cVar38 - (0xff < uVar261);
      uVar168 = CONCAT17(cVar21,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar376 -
                                         (0xff < uVar259),uVar167));
      cVar22 = (uVar342 != 0) * (uVar342 < 0x100) * cVar408 - (0xff < uVar342);
      auVar170._0_10_ =
           CONCAT19(cVar22,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar409 - (0xff < uVar322),
                                    uVar168));
      auVar170[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar39 - (0xff < uVar343);
      cVar23 = (uVar344 != 0) * (uVar344 < 0x100) * cVar40 - (0xff < uVar344);
      auVar170[0xb] = cVar23;
      auVar173[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar427 - (0xff < uVar345);
      auVar173._0_12_ = auVar170;
      cVar24 = (uVar346 != 0) * (uVar346 < 0x100) * cVar41 - (0xff < uVar346);
      auVar173[0xd] = cVar24;
      auVar222[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar42 - (0xff < uVar347);
      auVar222._0_14_ = auVar173;
      cVar25 = (uVar348 != 0) * (uVar348 < 0x100) * cVar43 - (0xff < uVar348);
      auVar222[0xf] = cVar25;
      auVar339 = auVar340 & auVar164;
      auVar282 = auVar401 & auVar164;
      sVar66 = auVar339._0_2_;
      sVar67 = auVar339._2_2_;
      bVar18 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[2] - (0xff < sVar67);
      sVar67 = auVar339._4_2_;
      sVar74 = auVar339._6_2_;
      cVar28 = (0 < sVar74) * (sVar74 < 0x100) * auVar339[6] - (0xff < sVar74);
      uVar228 = CONCAT13(cVar28,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar339[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar18,(0 < sVar66) * (sVar66 < 0x100) *
                                                         auVar339[0] - (0xff < sVar66))));
      sVar66 = auVar339._8_2_;
      sVar67 = auVar339._10_2_;
      cVar30 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[10] - (0xff < sVar67);
      uVar229 = CONCAT15(cVar30,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar339[8] -
                                         (0xff < sVar66),uVar228));
      sVar66 = auVar339._12_2_;
      sVar67 = auVar339._14_2_;
      cVar27 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[0xe] - (0xff < sVar67);
      uVar230 = CONCAT17(cVar27,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar339[0xc] -
                                         (0xff < sVar66),uVar229));
      sVar66 = auVar282._0_2_;
      sVar67 = auVar282._2_2_;
      cVar29 = (0 < sVar67) * (sVar67 < 0x100) * auVar282[2] - (0xff < sVar67);
      auVar232._0_10_ =
           CONCAT19(cVar29,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar282[0] - (0xff < sVar66),
                                    uVar230));
      sVar66 = auVar282._4_2_;
      auVar232[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar282[4] - (0xff < sVar66);
      sVar66 = auVar282._6_2_;
      cVar31 = (0 < sVar66) * (sVar66 < 0x100) * auVar282[6] - (0xff < sVar66);
      auVar232[0xb] = cVar31;
      sVar66 = auVar282._8_2_;
      auVar235[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar282[8] - (0xff < sVar66);
      auVar235._0_12_ = auVar232;
      sVar66 = auVar282._10_2_;
      cVar32 = (0 < sVar66) * (sVar66 < 0x100) * auVar282[10] - (0xff < sVar66);
      auVar235[0xd] = cVar32;
      sVar66 = auVar282._12_2_;
      auVar247[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar282[0xc] - (0xff < sVar66);
      auVar247._0_14_ = auVar235;
      sVar66 = auVar282._14_2_;
      cVar33 = (0 < sVar66) * (sVar66 < 0x100) * auVar282[0xe] - (0xff < sVar66);
      auVar247[0xf] = cVar33;
      auVar282 = auVar223 & auVar164;
      auVar339 = auVar312 & auVar164;
      sVar66 = auVar282._0_2_;
      sVar67 = auVar282._2_2_;
      bVar26 = (0 < sVar67) * (sVar67 < 0x100) * auVar282[2] - (0xff < sVar67);
      sVar67 = auVar282._4_2_;
      sVar74 = auVar282._6_2_;
      cVar376 = (0 < sVar74) * (sVar74 < 0x100) * auVar282[6] - (0xff < sVar74);
      uVar349 = CONCAT13(cVar376,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar282[4] -
                                          (0xff < sVar67),
                                          CONCAT11(bVar26,(0 < sVar66) * (sVar66 < 0x100) *
                                                          auVar282[0] - (0xff < sVar66))));
      sVar66 = auVar282._8_2_;
      sVar67 = auVar282._10_2_;
      cVar35 = (0 < sVar67) * (sVar67 < 0x100) * auVar282[10] - (0xff < sVar67);
      uVar350 = CONCAT15(cVar35,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar282[8] -
                                         (0xff < sVar66),uVar349));
      sVar66 = auVar282._12_2_;
      sVar67 = auVar282._14_2_;
      cVar37 = (0 < sVar67) * (sVar67 < 0x100) * auVar282[0xe] - (0xff < sVar67);
      uVar351 = CONCAT17(cVar37,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar282[0xc] -
                                         (0xff < sVar66),uVar350));
      sVar66 = auVar339._0_2_;
      sVar67 = auVar339._2_2_;
      cVar38 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[2] - (0xff < sVar67);
      auVar353._0_10_ =
           CONCAT19(cVar38,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar339[0] - (0xff < sVar66),
                                    uVar351));
      sVar66 = auVar339._4_2_;
      auVar353[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar339[4] - (0xff < sVar66);
      sVar66 = auVar339._6_2_;
      cVar36 = (0 < sVar66) * (sVar66 < 0x100) * auVar339[6] - (0xff < sVar66);
      auVar353[0xb] = cVar36;
      sVar66 = auVar339._8_2_;
      auVar355[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar339[8] - (0xff < sVar66);
      auVar355._0_12_ = auVar353;
      sVar66 = auVar339._10_2_;
      cVar407 = (0 < sVar66) * (sVar66 < 0x100) * auVar339[10] - (0xff < sVar66);
      auVar355[0xd] = cVar407;
      sVar66 = auVar339._12_2_;
      auVar374[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar339[0xc] - (0xff < sVar66);
      auVar374._0_14_ = auVar355;
      sVar66 = auVar339._14_2_;
      cVar34 = (0 < sVar66) * (sVar66 < 0x100) * auVar339[0xe] - (0xff < sVar66);
      auVar374[0xf] = cVar34;
      auVar339 = auVar313 & auVar164;
      auVar282 = auVar222 & auVar164;
      sVar66 = auVar339._0_2_;
      sVar67 = auVar339._2_2_;
      bVar377 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[2] - (0xff < sVar67);
      sVar67 = auVar339._4_2_;
      sVar74 = auVar339._6_2_;
      cVar408 = (0 < sVar74) * (sVar74 < 0x100) * auVar339[6] - (0xff < sVar74);
      uVar264 = CONCAT13(cVar408,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar339[4] -
                                          (0xff < sVar67),
                                          CONCAT11(bVar377,(0 < sVar66) * (sVar66 < 0x100) *
                                                           auVar339[0] - (0xff < sVar66))));
      sVar66 = auVar339._8_2_;
      sVar67 = auVar339._10_2_;
      cVar43 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[10] - (0xff < sVar67);
      uVar265 = CONCAT15(cVar43,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar339[8] -
                                         (0xff < sVar66),uVar264));
      sVar66 = auVar339._12_2_;
      sVar67 = auVar339._14_2_;
      cVar42 = (0 < sVar67) * (sVar67 < 0x100) * auVar339[0xe] - (0xff < sVar67);
      uVar266 = CONCAT17(cVar42,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar339[0xc] -
                                         (0xff < sVar66),uVar265));
      sVar66 = auVar282._0_2_;
      sVar67 = auVar282._2_2_;
      cVar41 = (0 < sVar67) * (sVar67 < 0x100) * auVar282[2] - (0xff < sVar67);
      auVar268._0_10_ =
           CONCAT19(cVar41,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar282[0] - (0xff < sVar66),
                                    uVar266));
      sVar66 = auVar282._4_2_;
      auVar268[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar282[4] - (0xff < sVar66);
      sVar66 = auVar282._6_2_;
      cVar427 = (0 < sVar66) * (sVar66 < 0x100) * auVar282[6] - (0xff < sVar66);
      auVar268[0xb] = cVar427;
      sVar66 = auVar282._8_2_;
      auVar271[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar282[8] - (0xff < sVar66);
      auVar271._0_12_ = auVar268;
      sVar66 = auVar282._10_2_;
      cVar40 = (0 < sVar66) * (sVar66 < 0x100) * auVar282[10] - (0xff < sVar66);
      auVar271[0xd] = cVar40;
      sVar66 = auVar282._12_2_;
      auVar283[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar282[0xc] - (0xff < sVar66);
      auVar283._0_14_ = auVar271;
      sVar66 = auVar282._14_2_;
      cVar39 = (0 < sVar66) * (sVar66 < 0x100) * auVar282[0xe] - (0xff < sVar66);
      auVar283[0xf] = cVar39;
      uVar226 = (ushort)bVar375;
      uVar249 = (ushort)((uint)uVar323 >> 0x18);
      uVar251 = (ushort)((uint6)uVar324 >> 0x28);
      uVar253 = (ushort)((ulong)uVar325 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar326._0_10_ >> 0x48);
      uVar257 = auVar326._10_2_ >> 8;
      uVar259 = auVar328._12_2_ >> 8;
      uVar261 = auVar340._14_2_ >> 8;
      uVar322 = (ushort)bVar404;
      uVar342 = (ushort)((uint)uVar379 >> 0x18);
      uVar343 = (ushort)((uint6)uVar380 >> 0x28);
      uVar344 = (ushort)((ulong)uVar381 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar382._0_10_ >> 0x48);
      uVar346 = auVar382._10_2_ >> 8;
      uVar347 = auVar384._12_2_ >> 8;
      uVar348 = auVar401._14_2_ >> 8;
      bVar409 = (uVar249 != 0) * (uVar249 < 0x100) * cVar44 - (0xff < uVar249);
      cVar46 = (uVar253 != 0) * (uVar253 < 0x100) * cVar46 - (0xff < uVar253);
      uVar323 = CONCAT13(cVar46,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar45 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar409,(uVar226 != 0) * (uVar226 < 0x100) *
                                                          bVar375 - (0xff < uVar226))));
      cVar65 = (uVar257 != 0) * (uVar257 < 0x100) * cVar48 - (0xff < uVar257);
      uVar324 = CONCAT15(cVar65,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar47 -
                                         (0xff < uVar255),uVar323));
      cVar45 = (uVar261 != 0) * (uVar261 < 0x100) * cVar50 - (0xff < uVar261);
      uVar325 = CONCAT17(cVar45,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar49 -
                                         (0xff < uVar259),uVar324));
      cVar44 = (uVar342 != 0) * (uVar342 < 0x100) * cVar51 - (0xff < uVar342);
      auVar327._0_10_ =
           CONCAT19(cVar44,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar404 - (0xff < uVar322),
                                    uVar325));
      auVar327[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar52 - (0xff < uVar343);
      cVar48 = (uVar344 != 0) * (uVar344 < 0x100) * cVar53 - (0xff < uVar344);
      auVar327[0xb] = cVar48;
      auVar329[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar54 - (0xff < uVar345);
      auVar329._0_12_ = auVar327;
      cVar50 = (uVar346 != 0) * (uVar346 < 0x100) * cVar55 - (0xff < uVar346);
      auVar329[0xd] = cVar50;
      auVar341[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar56 - (0xff < uVar347);
      auVar341._0_14_ = auVar329;
      cVar49 = (uVar348 != 0) * (uVar348 < 0x100) * cVar57 - (0xff < uVar348);
      auVar341[0xf] = cVar49;
      uVar226 = (ushort)bVar405;
      uVar249 = (ushort)((uint)uVar205 >> 0x18);
      uVar251 = (ushort)((uint6)uVar206 >> 0x28);
      uVar253 = (ushort)((ulong)uVar207 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar208._0_10_ >> 0x48);
      uVar257 = auVar208._10_2_ >> 8;
      uVar259 = auVar211._12_2_ >> 8;
      uVar261 = auVar223._14_2_ >> 8;
      uVar322 = (ushort)bVar410;
      uVar342 = (ushort)((uint)uVar293 >> 0x18);
      uVar343 = (ushort)((uint6)uVar294 >> 0x28);
      uVar344 = (ushort)((ulong)uVar295 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar297._0_10_ >> 0x48);
      uVar346 = auVar297._10_2_ >> 8;
      uVar347 = auVar300._12_2_ >> 8;
      uVar348 = auVar312._14_2_ >> 8;
      bVar375 = (uVar249 != 0) * (uVar249 < 0x100) * cVar58 - (0xff < uVar249);
      cVar53 = (uVar253 != 0) * (uVar253 < 0x100) * cVar60 - (0xff < uVar253);
      uVar205 = CONCAT13(cVar53,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar59 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar375,(uVar226 != 0) * (uVar226 < 0x100) *
                                                          bVar405 - (0xff < uVar226))));
      cVar52 = (uVar257 != 0) * (uVar257 < 0x100) * cVar62 - (0xff < uVar257);
      uVar206 = CONCAT15(cVar52,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar61 -
                                         (0xff < uVar255),uVar205));
      cVar51 = (uVar261 != 0) * (uVar261 < 0x100) * cVar64 - (0xff < uVar261);
      uVar207 = CONCAT17(cVar51,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar63 -
                                         (0xff < uVar259),uVar206));
      cVar5 = (uVar342 != 0) * (uVar342 < 0x100) * cVar5 - (0xff < uVar342);
      auVar209._0_10_ =
           CONCAT19(cVar5,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar410 - (0xff < uVar322),
                                   uVar207));
      auVar209[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar4 - (0xff < uVar343);
      cVar47 = (uVar344 != 0) * (uVar344 < 0x100) * cVar6 - (0xff < uVar344);
      auVar209[0xb] = cVar47;
      auVar212[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar7 - (0xff < uVar345);
      auVar212._0_12_ = auVar209;
      cVar6 = (uVar346 != 0) * (uVar346 < 0x100) * cVar8 - (0xff < uVar346);
      auVar212[0xd] = cVar6;
      auVar224[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar9 - (0xff < uVar347);
      auVar224._0_14_ = auVar212;
      cVar4 = (uVar348 != 0) * (uVar348 < 0x100) * cVar3 - (0xff < uVar348);
      auVar224[0xf] = cVar4;
      uVar322 = (ushort)bVar2;
      uVar342 = (ushort)((uint)uVar184 >> 0x18);
      uVar343 = (ushort)((uint6)uVar185 >> 0x28);
      uVar344 = (ushort)((ulong)uVar186 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar188._0_10_ >> 0x48);
      uVar346 = auVar188._10_2_ >> 8;
      uVar347 = auVar191._12_2_ >> 8;
      uVar348 = auVar313._14_2_ >> 8;
      uVar226 = (ushort)bVar10;
      uVar249 = (ushort)((uint)uVar166 >> 0x18);
      uVar251 = (ushort)((uint6)uVar167 >> 0x28);
      uVar253 = (ushort)((ulong)uVar168 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar170._0_10_ >> 0x48);
      uVar257 = auVar170._10_2_ >> 8;
      uVar259 = auVar173._12_2_ >> 8;
      uVar261 = auVar222._14_2_ >> 8;
      bVar404 = (uVar342 != 0) * (uVar342 < 0x100) * cVar16 - (0xff < uVar342);
      cVar7 = (uVar344 != 0) * (uVar344 < 0x100) * cVar13 - (0xff < uVar344);
      uVar184 = CONCAT13(cVar7,CONCAT12((uVar343 != 0) * (uVar343 < 0x100) * cVar12 -
                                        (0xff < uVar343),
                                        CONCAT11(bVar404,(uVar322 != 0) * (uVar322 < 0x100) * bVar2
                                                         - (0xff < uVar322))));
      cVar8 = (uVar346 != 0) * (uVar346 < 0x100) * cVar14 - (0xff < uVar346);
      uVar185 = CONCAT15(cVar8,CONCAT14((uVar345 != 0) * (uVar345 < 0x100) * cVar11 -
                                        (0xff < uVar345),uVar184));
      cVar9 = (uVar348 != 0) * (uVar348 < 0x100) * cVar17 - (0xff < uVar348);
      uVar186 = CONCAT17(cVar9,CONCAT16((uVar347 != 0) * (uVar347 < 0x100) * cVar15 -
                                        (0xff < uVar347),uVar185));
      cVar3 = (uVar249 != 0) * (uVar249 < 0x100) * cVar19 - (0xff < uVar249);
      auVar189._0_10_ =
           CONCAT19(cVar3,CONCAT18((uVar226 != 0) * (uVar226 < 0x100) * bVar10 - (0xff < uVar226),
                                   uVar186));
      auVar189[10] = (uVar251 != 0) * (uVar251 < 0x100) * cVar20 - (0xff < uVar251);
      cVar16 = (uVar253 != 0) * (uVar253 < 0x100) * cVar21 - (0xff < uVar253);
      auVar189[0xb] = cVar16;
      auVar192[0xc] = (uVar255 != 0) * (uVar255 < 0x100) * cVar22 - (0xff < uVar255);
      auVar192._0_12_ = auVar189;
      cVar17 = (uVar257 != 0) * (uVar257 < 0x100) * cVar23 - (0xff < uVar257);
      auVar192[0xd] = cVar17;
      auVar282[0xe] = (uVar259 != 0) * (uVar259 < 0x100) * cVar24 - (0xff < uVar259);
      auVar282._0_14_ = auVar192;
      cVar15 = (uVar261 != 0) * (uVar261 < 0x100) * cVar25 - (0xff < uVar261);
      auVar282[0xf] = cVar15;
      auVar222 = auVar247 & auVar164;
      auVar313 = auVar374 & auVar164;
      sVar66 = auVar222._0_2_;
      sVar67 = auVar222._2_2_;
      bVar2 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[2] - (0xff < sVar67);
      sVar67 = auVar222._4_2_;
      sVar74 = auVar222._6_2_;
      cVar14 = (0 < sVar74) * (sVar74 < 0x100) * auVar222[6] - (0xff < sVar74);
      uVar166 = CONCAT13(cVar14,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar222[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar2,(0 < sVar66) * (sVar66 < 0x100) *
                                                        auVar222[0] - (0xff < sVar66))));
      sVar66 = auVar222._8_2_;
      sVar67 = auVar222._10_2_;
      cVar21 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[10] - (0xff < sVar67);
      uVar167 = CONCAT15(cVar21,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar222[8] -
                                         (0xff < sVar66),uVar166));
      sVar66 = auVar222._12_2_;
      sVar67 = auVar222._14_2_;
      cVar20 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[0xe] - (0xff < sVar67);
      uVar168 = CONCAT17(cVar20,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar222[0xc] -
                                         (0xff < sVar66),uVar167));
      sVar66 = auVar313._0_2_;
      sVar67 = auVar313._2_2_;
      cVar19 = (0 < sVar67) * (sVar67 < 0x100) * auVar313[2] - (0xff < sVar67);
      auVar171._0_10_ =
           CONCAT19(cVar19,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar313[0] - (0xff < sVar66),
                                    uVar168));
      sVar66 = auVar313._4_2_;
      auVar171[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar313[4] - (0xff < sVar66);
      sVar66 = auVar313._6_2_;
      cVar11 = (0 < sVar66) * (sVar66 < 0x100) * auVar313[6] - (0xff < sVar66);
      auVar171[0xb] = cVar11;
      sVar66 = auVar313._8_2_;
      auVar174[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar313[8] - (0xff < sVar66);
      auVar174._0_12_ = auVar171;
      sVar66 = auVar313._10_2_;
      cVar12 = (0 < sVar66) * (sVar66 < 0x100) * auVar313[10] - (0xff < sVar66);
      auVar174[0xd] = cVar12;
      sVar66 = auVar313._12_2_;
      auVar339[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar313[0xc] - (0xff < sVar66);
      auVar339._0_14_ = auVar174;
      sVar66 = auVar313._14_2_;
      cVar13 = (0 < sVar66) * (sVar66 < 0x100) * auVar313[0xe] - (0xff < sVar66);
      auVar339[0xf] = cVar13;
      auVar313 = auVar283 & auVar164;
      auVar222 = auVar341 & auVar164;
      sVar66 = auVar313._0_2_;
      sVar67 = auVar313._2_2_;
      bVar10 = (0 < sVar67) * (sVar67 < 0x100) * auVar313[2] - (0xff < sVar67);
      sVar67 = auVar313._4_2_;
      sVar74 = auVar313._6_2_;
      cVar55 = (0 < sVar74) * (sVar74 < 0x100) * auVar313[6] - (0xff < sVar74);
      uVar379 = CONCAT13(cVar55,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar313[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar10,(0 < sVar66) * (sVar66 < 0x100) *
                                                         auVar313[0] - (0xff < sVar66))));
      sVar66 = auVar313._8_2_;
      sVar67 = auVar313._10_2_;
      cVar54 = (0 < sVar67) * (sVar67 < 0x100) * auVar313[10] - (0xff < sVar67);
      uVar380 = CONCAT15(cVar54,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar313[8] -
                                         (0xff < sVar66),uVar379));
      sVar66 = auVar313._12_2_;
      sVar67 = auVar313._14_2_;
      cVar25 = (0 < sVar67) * (sVar67 < 0x100) * auVar313[0xe] - (0xff < sVar67);
      uVar381 = CONCAT17(cVar25,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar313[0xc] -
                                         (0xff < sVar66),uVar380));
      sVar66 = auVar222._0_2_;
      sVar67 = auVar222._2_2_;
      cVar56 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[2] - (0xff < sVar67);
      auVar383._0_10_ =
           CONCAT19(cVar56,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar222[0] - (0xff < sVar66),
                                    uVar381));
      sVar66 = auVar222._4_2_;
      auVar383[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[4] - (0xff < sVar66);
      sVar66 = auVar222._6_2_;
      cVar24 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[6] - (0xff < sVar66);
      auVar383[0xb] = cVar24;
      sVar66 = auVar222._8_2_;
      auVar385[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[8] - (0xff < sVar66);
      auVar385._0_12_ = auVar383;
      sVar66 = auVar222._10_2_;
      cVar23 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[10] - (0xff < sVar66);
      auVar385[0xd] = cVar23;
      sVar66 = auVar222._12_2_;
      auVar402[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0xc] - (0xff < sVar66);
      auVar402._0_14_ = auVar385;
      sVar66 = auVar222._14_2_;
      cVar22 = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0xe] - (0xff < sVar66);
      auVar402[0xf] = cVar22;
      auVar222 = auVar224 & auVar164;
      auVar313 = auVar282 & auVar164;
      sVar66 = auVar222._0_2_;
      sVar67 = auVar222._2_2_;
      bVar405 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[2] - (0xff < sVar67);
      sVar67 = auVar222._4_2_;
      sVar74 = auVar222._6_2_;
      cVar59 = (0 < sVar74) * (sVar74 < 0x100) * auVar222[6] - (0xff < sVar74);
      uVar293 = CONCAT13(cVar59,CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar222[4] -
                                         (0xff < sVar67),
                                         CONCAT11(bVar405,(0 < sVar66) * (sVar66 < 0x100) *
                                                          auVar222[0] - (0xff < sVar66))));
      sVar66 = auVar222._8_2_;
      sVar67 = auVar222._10_2_;
      cVar60 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[10] - (0xff < sVar67);
      uVar294 = CONCAT15(cVar60,CONCAT14((0 < sVar66) * (sVar66 < 0x100) * auVar222[8] -
                                         (0xff < sVar66),uVar293));
      sVar66 = auVar222._12_2_;
      sVar67 = auVar222._14_2_;
      cVar62 = (0 < sVar67) * (sVar67 < 0x100) * auVar222[0xe] - (0xff < sVar67);
      uVar295 = CONCAT17(cVar62,CONCAT16((0 < sVar66) * (sVar66 < 0x100) * auVar222[0xc] -
                                         (0xff < sVar66),uVar294));
      sVar66 = auVar313._0_2_;
      sVar67 = auVar313._2_2_;
      cVar63 = (0 < sVar67) * (sVar67 < 0x100) * auVar313[2] - (0xff < sVar67);
      auVar298._0_10_ =
           CONCAT19(cVar63,CONCAT18((0 < sVar66) * (sVar66 < 0x100) * auVar313[0] - (0xff < sVar66),
                                    uVar295));
      sVar66 = auVar313._4_2_;
      auVar298[10] = (0 < sVar66) * (sVar66 < 0x100) * auVar313[4] - (0xff < sVar66);
      sVar66 = auVar313._6_2_;
      cVar64 = (0 < sVar66) * (sVar66 < 0x100) * auVar313[6] - (0xff < sVar66);
      auVar298[0xb] = cVar64;
      sVar66 = auVar313._8_2_;
      auVar301[0xc] = (0 < sVar66) * (sVar66 < 0x100) * auVar313[8] - (0xff < sVar66);
      auVar301._0_12_ = auVar298;
      sVar66 = auVar313._10_2_;
      cVar61 = (0 < sVar66) * (sVar66 < 0x100) * auVar313[10] - (0xff < sVar66);
      auVar301[0xd] = cVar61;
      sVar66 = auVar313._12_2_;
      auVar314[0xe] = (0 < sVar66) * (sVar66 < 0x100) * auVar313[0xc] - (0xff < sVar66);
      auVar314._0_14_ = auVar301;
      sVar66 = auVar313._14_2_;
      cVar57 = (0 < sVar66) * (sVar66 < 0x100) * auVar313[0xe] - (0xff < sVar66);
      auVar314[0xf] = cVar57;
      uVar226 = (ushort)bVar18;
      uVar249 = (ushort)((uint)uVar228 >> 0x18);
      uVar251 = (ushort)((uint6)uVar229 >> 0x28);
      uVar253 = (ushort)((ulong)uVar230 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar232._0_10_ >> 0x48);
      uVar257 = auVar232._10_2_ >> 8;
      uVar259 = auVar235._12_2_ >> 8;
      uVar261 = auVar247._14_2_ >> 8;
      uVar322 = (ushort)bVar26;
      uVar342 = (ushort)((uint)uVar349 >> 0x18);
      uVar343 = (ushort)((uint6)uVar350 >> 0x28);
      uVar344 = (ushort)((ulong)uVar351 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar353._0_10_ >> 0x48);
      uVar346 = auVar353._10_2_ >> 8;
      uVar347 = auVar355._12_2_ >> 8;
      uVar348 = auVar374._14_2_ >> 8;
      bVar410 = (uVar249 != 0) * (uVar249 < 0x100) * cVar28 - (0xff < uVar249);
      cVar28 = (uVar253 != 0) * (uVar253 < 0x100) * cVar27 - (0xff < uVar253);
      uVar228 = CONCAT13(cVar28,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar30 -
                                         (0xff < uVar251),
                                         CONCAT11(bVar410,(uVar226 != 0) * (uVar226 < 0x100) *
                                                          bVar18 - (0xff < uVar226))));
      cVar31 = (uVar257 != 0) * (uVar257 < 0x100) * cVar31 - (0xff < uVar257);
      uVar229 = CONCAT15(cVar31,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar29 -
                                         (0xff < uVar255),uVar228));
      cVar33 = (uVar261 != 0) * (uVar261 < 0x100) * cVar33 - (0xff < uVar261);
      uVar230 = CONCAT17(cVar33,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar32 -
                                         (0xff < uVar259),uVar229));
      cVar32 = (uVar342 != 0) * (uVar342 < 0x100) * cVar376 - (0xff < uVar342);
      auVar233._0_10_ =
           CONCAT19(cVar32,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar26 - (0xff < uVar322),
                                    uVar230));
      auVar233[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar35 - (0xff < uVar343);
      cVar29 = (uVar344 != 0) * (uVar344 < 0x100) * cVar37 - (0xff < uVar344);
      auVar233[0xb] = cVar29;
      auVar236[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar38 - (0xff < uVar345);
      auVar236._0_12_ = auVar233;
      cVar27 = (uVar346 != 0) * (uVar346 < 0x100) * cVar36 - (0xff < uVar346);
      auVar236[0xd] = cVar27;
      auVar248[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar407 - (0xff < uVar347);
      auVar248._0_14_ = auVar236;
      cVar30 = (uVar348 != 0) * (uVar348 < 0x100) * cVar34 - (0xff < uVar348);
      auVar248[0xf] = cVar30;
      uVar226 = (ushort)bVar377;
      uVar249 = (ushort)((uint)uVar264 >> 0x18);
      uVar251 = (ushort)((uint6)uVar265 >> 0x28);
      uVar253 = (ushort)((ulong)uVar266 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar268._0_10_ >> 0x48);
      uVar257 = auVar268._10_2_ >> 8;
      uVar259 = auVar271._12_2_ >> 8;
      uVar261 = auVar283._14_2_ >> 8;
      uVar322 = (ushort)bVar409;
      uVar342 = (ushort)((uint)uVar323 >> 0x18);
      uVar343 = (ushort)((uint6)uVar324 >> 0x28);
      uVar344 = (ushort)((ulong)uVar325 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar327._0_10_ >> 0x48);
      uVar346 = auVar327._10_2_ >> 8;
      uVar347 = auVar329._12_2_ >> 8;
      uVar348 = auVar341._14_2_ >> 8;
      bVar18 = (uVar249 != 0) * (uVar249 < 0x100) * cVar408 - (0xff < uVar249);
      cVar376 = (uVar253 != 0) * (uVar253 < 0x100) * cVar42 - (0xff < uVar253);
      uVar264 = CONCAT13(cVar376,CONCAT12((uVar251 != 0) * (uVar251 < 0x100) * cVar43 -
                                          (0xff < uVar251),
                                          CONCAT11(bVar18,(uVar226 != 0) * (uVar226 < 0x100) *
                                                          bVar377 - (0xff < uVar226))));
      cVar37 = (uVar257 != 0) * (uVar257 < 0x100) * cVar427 - (0xff < uVar257);
      uVar265 = CONCAT15(cVar37,CONCAT14((uVar255 != 0) * (uVar255 < 0x100) * cVar41 -
                                         (0xff < uVar255),uVar264));
      cVar36 = (uVar261 != 0) * (uVar261 < 0x100) * cVar39 - (0xff < uVar261);
      uVar266 = CONCAT17(cVar36,CONCAT16((uVar259 != 0) * (uVar259 < 0x100) * cVar40 -
                                         (0xff < uVar259),uVar265));
      cVar38 = (uVar342 != 0) * (uVar342 < 0x100) * cVar46 - (0xff < uVar342);
      auVar269._0_10_ =
           CONCAT19(cVar38,CONCAT18((uVar322 != 0) * (uVar322 < 0x100) * bVar409 - (0xff < uVar322),
                                    uVar266));
      auVar269[10] = (uVar343 != 0) * (uVar343 < 0x100) * cVar65 - (0xff < uVar343);
      cVar407 = (uVar344 != 0) * (uVar344 < 0x100) * cVar45 - (0xff < uVar344);
      auVar269[0xb] = cVar407;
      auVar272[0xc] = (uVar345 != 0) * (uVar345 < 0x100) * cVar44 - (0xff < uVar345);
      auVar272._0_12_ = auVar269;
      cVar35 = (uVar346 != 0) * (uVar346 < 0x100) * cVar48 - (0xff < uVar346);
      auVar272[0xd] = cVar35;
      auVar284[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * cVar50 - (0xff < uVar347);
      auVar284._0_14_ = auVar272;
      cVar34 = (uVar348 != 0) * (uVar348 < 0x100) * cVar49 - (0xff < uVar348);
      auVar284[0xf] = cVar34;
      uVar322 = (ushort)bVar375;
      uVar342 = (ushort)((uint)uVar205 >> 0x18);
      uVar343 = (ushort)((uint6)uVar206 >> 0x28);
      uVar344 = (ushort)((ulong)uVar207 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar209._0_10_ >> 0x48);
      uVar346 = auVar209._10_2_ >> 8;
      uVar347 = auVar212._12_2_ >> 8;
      uVar348 = auVar224._14_2_ >> 8;
      uVar226 = (ushort)bVar404;
      uVar249 = (ushort)((uint)uVar184 >> 0x18);
      uVar251 = (ushort)((uint6)uVar185 >> 0x28);
      uVar253 = (ushort)((ulong)uVar186 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar189._0_10_ >> 0x48);
      uVar257 = auVar189._10_2_ >> 8;
      uVar259 = auVar192._12_2_ >> 8;
      uVar261 = auVar282._14_2_ >> 8;
      bVar26 = (uVar342 != 0) * (uVar342 < 0x100) * cVar53 - (0xff < uVar342);
      cVar408 = (uVar344 != 0) * (uVar344 < 0x100) * cVar51 - (0xff < uVar344);
      uVar184 = CONCAT13(cVar408,CONCAT12((uVar343 != 0) * (uVar343 < 0x100) * cVar52 -
                                          (0xff < uVar343),
                                          CONCAT11(bVar26,(uVar322 != 0) * (uVar322 < 0x100) *
                                                          bVar375 - (0xff < uVar322))));
      cVar43 = (uVar346 != 0) * (uVar346 < 0x100) * cVar47 - (0xff < uVar346);
      uVar185 = CONCAT15(cVar43,CONCAT14((uVar345 != 0) * (uVar345 < 0x100) * cVar5 -
                                         (0xff < uVar345),uVar184));
      cVar4 = (uVar348 != 0) * (uVar348 < 0x100) * cVar4 - (0xff < uVar348);
      uVar186 = CONCAT17(cVar4,CONCAT16((uVar347 != 0) * (uVar347 < 0x100) * cVar6 -
                                        (0xff < uVar347),uVar185));
      cVar5 = (uVar249 != 0) * (uVar249 < 0x100) * cVar7 - (0xff < uVar249);
      auVar210._0_10_ =
           CONCAT19(cVar5,CONCAT18((uVar226 != 0) * (uVar226 < 0x100) * bVar404 - (0xff < uVar226),
                                   uVar186));
      auVar210[10] = (uVar251 != 0) * (uVar251 < 0x100) * cVar8 - (0xff < uVar251);
      cVar6 = (uVar253 != 0) * (uVar253 < 0x100) * cVar9 - (0xff < uVar253);
      auVar210[0xb] = cVar6;
      auVar213[0xc] = (uVar255 != 0) * (uVar255 < 0x100) * cVar3 - (0xff < uVar255);
      auVar213._0_12_ = auVar210;
      cVar7 = (uVar257 != 0) * (uVar257 < 0x100) * cVar16 - (0xff < uVar257);
      auVar213[0xd] = cVar7;
      auVar225[0xe] = (uVar259 != 0) * (uVar259 < 0x100) * cVar17 - (0xff < uVar259);
      auVar225._0_14_ = auVar213;
      cVar8 = (uVar261 != 0) * (uVar261 < 0x100) * cVar15 - (0xff < uVar261);
      auVar225[0xf] = cVar8;
      auVar222 = auVar339 & auVar164;
      auVar313 = auVar402 & auVar164;
      sVar66 = auVar222._0_2_;
      sVar68 = auVar222._2_2_;
      sVar71 = auVar222._4_2_;
      sVar75 = auVar222._6_2_;
      sVar78 = auVar222._8_2_;
      sVar81 = auVar222._10_2_;
      sVar84 = auVar222._12_2_;
      sVar87 = auVar222._14_2_;
      sVar90 = auVar313._0_2_;
      sVar93 = auVar313._2_2_;
      sVar96 = auVar313._4_2_;
      sVar99 = auVar313._6_2_;
      sVar102 = auVar313._8_2_;
      sVar105 = auVar313._10_2_;
      sVar108 = auVar313._12_2_;
      sVar111 = auVar313._14_2_;
      auVar282 = auVar314 & auVar164;
      auVar201 = auVar248 & auVar164;
      sVar67 = auVar282._0_2_;
      sVar69 = auVar282._2_2_;
      sVar72 = auVar282._4_2_;
      sVar76 = auVar282._6_2_;
      sVar79 = auVar282._8_2_;
      sVar82 = auVar282._10_2_;
      sVar85 = auVar282._12_2_;
      sVar88 = auVar282._14_2_;
      sVar91 = auVar201._0_2_;
      sVar94 = auVar201._2_2_;
      sVar97 = auVar201._4_2_;
      sVar100 = auVar201._6_2_;
      sVar103 = auVar201._8_2_;
      sVar106 = auVar201._10_2_;
      sVar109 = auVar201._12_2_;
      sVar112 = auVar201._14_2_;
      auVar310 = auVar284 & auVar164;
      auVar425 = auVar225 & auVar164;
      sVar74 = auVar310._0_2_;
      sVar70 = auVar310._2_2_;
      sVar73 = auVar310._4_2_;
      sVar77 = auVar310._6_2_;
      sVar80 = auVar310._8_2_;
      sVar83 = auVar310._10_2_;
      sVar86 = auVar310._12_2_;
      sVar89 = auVar310._14_2_;
      sVar92 = auVar425._0_2_;
      sVar95 = auVar425._2_2_;
      sVar98 = auVar425._4_2_;
      sVar101 = auVar425._6_2_;
      sVar104 = auVar425._8_2_;
      sVar107 = auVar425._10_2_;
      sVar110 = auVar425._12_2_;
      sVar113 = auVar425._14_2_;
      uVar226 = (ushort)bVar2;
      uVar249 = (ushort)((uint)uVar166 >> 0x18);
      uVar251 = (ushort)((uint6)uVar167 >> 0x28);
      uVar253 = (ushort)((ulong)uVar168 >> 0x38);
      uVar255 = (ushort)((unkuint10)auVar171._0_10_ >> 0x48);
      uVar257 = auVar171._10_2_ >> 8;
      uVar259 = auVar174._12_2_ >> 8;
      uVar261 = auVar339._14_2_ >> 8;
      uVar378 = (ushort)bVar10;
      uVar403 = (ushort)((uint)uVar379 >> 0x18);
      uVar406 = (ushort)((uint6)uVar380 >> 0x28);
      uVar411 = (ushort)((ulong)uVar381 >> 0x38);
      uVar412 = (ushort)((unkuint10)auVar383._0_10_ >> 0x48);
      uVar413 = auVar383._10_2_ >> 8;
      uVar414 = auVar385._12_2_ >> 8;
      uVar415 = auVar402._14_2_ >> 8;
      uVar292 = (ushort)bVar405;
      uVar315 = (ushort)((uint)uVar293 >> 0x18);
      uVar316 = (ushort)((uint6)uVar294 >> 0x28);
      uVar317 = (ushort)((ulong)uVar295 >> 0x38);
      uVar318 = (ushort)((unkuint10)auVar298._0_10_ >> 0x48);
      uVar319 = auVar298._10_2_ >> 8;
      uVar320 = auVar301._12_2_ >> 8;
      uVar321 = auVar314._14_2_ >> 8;
      uVar227 = (ushort)bVar410;
      uVar250 = (ushort)((uint)uVar228 >> 0x18);
      uVar252 = (ushort)((uint6)uVar229 >> 0x28);
      uVar254 = (ushort)((ulong)uVar230 >> 0x38);
      uVar256 = (ushort)((unkuint10)auVar233._0_10_ >> 0x48);
      uVar258 = auVar233._10_2_ >> 8;
      uVar260 = auVar236._12_2_ >> 8;
      uVar262 = auVar248._14_2_ >> 8;
      uVar263 = (ushort)bVar18;
      uVar285 = (ushort)((uint)uVar264 >> 0x18);
      uVar286 = (ushort)((uint6)uVar265 >> 0x28);
      uVar287 = (ushort)((ulong)uVar266 >> 0x38);
      uVar288 = (ushort)((unkuint10)auVar269._0_10_ >> 0x48);
      uVar289 = auVar269._10_2_ >> 8;
      uVar290 = auVar272._12_2_ >> 8;
      uVar291 = auVar284._14_2_ >> 8;
      uVar322 = (ushort)bVar26;
      uVar342 = (ushort)((uint)uVar184 >> 0x18);
      uVar343 = (ushort)((uint6)uVar185 >> 0x28);
      uVar344 = (ushort)((ulong)uVar186 >> 0x38);
      uVar345 = (ushort)((unkuint10)auVar210._0_10_ >> 0x48);
      uVar346 = auVar210._10_2_ >> 8;
      uVar347 = auVar213._12_2_ >> 8;
      uVar348 = auVar225._14_2_ >> 8;
      *dst = (0 < sVar66) * (sVar66 < 0x100) * auVar222[0] - (0xff < sVar66);
      dst[1] = (0 < sVar68) * (sVar68 < 0x100) * auVar222[2] - (0xff < sVar68);
      dst[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar222[4] - (0xff < sVar71);
      dst[3] = (0 < sVar75) * (sVar75 < 0x100) * auVar222[6] - (0xff < sVar75);
      dst[4] = (0 < sVar78) * (sVar78 < 0x100) * auVar222[8] - (0xff < sVar78);
      dst[5] = (0 < sVar81) * (sVar81 < 0x100) * auVar222[10] - (0xff < sVar81);
      dst[6] = (0 < sVar84) * (sVar84 < 0x100) * auVar222[0xc] - (0xff < sVar84);
      dst[7] = (0 < sVar87) * (sVar87 < 0x100) * auVar222[0xe] - (0xff < sVar87);
      dst[8] = (0 < sVar90) * (sVar90 < 0x100) * auVar313[0] - (0xff < sVar90);
      dst[9] = (0 < sVar93) * (sVar93 < 0x100) * auVar313[2] - (0xff < sVar93);
      dst[10] = (0 < sVar96) * (sVar96 < 0x100) * auVar313[4] - (0xff < sVar96);
      dst[0xb] = (0 < sVar99) * (sVar99 < 0x100) * auVar313[6] - (0xff < sVar99);
      dst[0xc] = (0 < sVar102) * (sVar102 < 0x100) * auVar313[8] - (0xff < sVar102);
      dst[0xd] = (0 < sVar105) * (sVar105 < 0x100) * auVar313[10] - (0xff < sVar105);
      dst[0xe] = (0 < sVar108) * (sVar108 < 0x100) * auVar313[0xc] - (0xff < sVar108);
      dst[0xf] = (0 < sVar111) * (sVar111 < 0x100) * auVar313[0xe] - (0xff < sVar111);
      dst[0x10] = (0 < sVar67) * (sVar67 < 0x100) * auVar282[0] - (0xff < sVar67);
      dst[0x11] = (0 < sVar69) * (sVar69 < 0x100) * auVar282[2] - (0xff < sVar69);
      dst[0x12] = (0 < sVar72) * (sVar72 < 0x100) * auVar282[4] - (0xff < sVar72);
      dst[0x13] = (0 < sVar76) * (sVar76 < 0x100) * auVar282[6] - (0xff < sVar76);
      dst[0x14] = (0 < sVar79) * (sVar79 < 0x100) * auVar282[8] - (0xff < sVar79);
      dst[0x15] = (0 < sVar82) * (sVar82 < 0x100) * auVar282[10] - (0xff < sVar82);
      dst[0x16] = (0 < sVar85) * (sVar85 < 0x100) * auVar282[0xc] - (0xff < sVar85);
      dst[0x17] = (0 < sVar88) * (sVar88 < 0x100) * auVar282[0xe] - (0xff < sVar88);
      dst[0x18] = (0 < sVar91) * (sVar91 < 0x100) * auVar201[0] - (0xff < sVar91);
      dst[0x19] = (0 < sVar94) * (sVar94 < 0x100) * auVar201[2] - (0xff < sVar94);
      dst[0x1a] = (0 < sVar97) * (sVar97 < 0x100) * auVar201[4] - (0xff < sVar97);
      dst[0x1b] = (0 < sVar100) * (sVar100 < 0x100) * auVar201[6] - (0xff < sVar100);
      dst[0x1c] = (0 < sVar103) * (sVar103 < 0x100) * auVar201[8] - (0xff < sVar103);
      dst[0x1d] = (0 < sVar106) * (sVar106 < 0x100) * auVar201[10] - (0xff < sVar106);
      dst[0x1e] = (0 < sVar109) * (sVar109 < 0x100) * auVar201[0xc] - (0xff < sVar109);
      dst[0x1f] = (0 < sVar112) * (sVar112 < 0x100) * auVar201[0xe] - (0xff < sVar112);
      dst[0x20] = (0 < sVar74) * (sVar74 < 0x100) * auVar310[0] - (0xff < sVar74);
      dst[0x21] = (0 < sVar70) * (sVar70 < 0x100) * auVar310[2] - (0xff < sVar70);
      dst[0x22] = (0 < sVar73) * (sVar73 < 0x100) * auVar310[4] - (0xff < sVar73);
      dst[0x23] = (0 < sVar77) * (sVar77 < 0x100) * auVar310[6] - (0xff < sVar77);
      dst[0x24] = (0 < sVar80) * (sVar80 < 0x100) * auVar310[8] - (0xff < sVar80);
      dst[0x25] = (0 < sVar83) * (sVar83 < 0x100) * auVar310[10] - (0xff < sVar83);
      dst[0x26] = (0 < sVar86) * (sVar86 < 0x100) * auVar310[0xc] - (0xff < sVar86);
      dst[0x27] = (0 < sVar89) * (sVar89 < 0x100) * auVar310[0xe] - (0xff < sVar89);
      dst[0x28] = (0 < sVar92) * (sVar92 < 0x100) * auVar425[0] - (0xff < sVar92);
      dst[0x29] = (0 < sVar95) * (sVar95 < 0x100) * auVar425[2] - (0xff < sVar95);
      dst[0x2a] = (0 < sVar98) * (sVar98 < 0x100) * auVar425[4] - (0xff < sVar98);
      dst[0x2b] = (0 < sVar101) * (sVar101 < 0x100) * auVar425[6] - (0xff < sVar101);
      dst[0x2c] = (0 < sVar104) * (sVar104 < 0x100) * auVar425[8] - (0xff < sVar104);
      dst[0x2d] = (0 < sVar107) * (sVar107 < 0x100) * auVar425[10] - (0xff < sVar107);
      dst[0x2e] = (0 < sVar110) * (sVar110 < 0x100) * auVar425[0xc] - (0xff < sVar110);
      dst[0x2f] = (0 < sVar113) * (sVar113 < 0x100) * auVar425[0xe] - (0xff < sVar113);
      dst[0x30] = (uVar226 != 0) * (uVar226 < 0x100) * bVar2 - (0xff < uVar226);
      dst[0x31] = (uVar249 != 0) * (uVar249 < 0x100) * cVar14 - (0xff < uVar249);
      dst[0x32] = (uVar251 != 0) * (uVar251 < 0x100) * cVar21 - (0xff < uVar251);
      dst[0x33] = (uVar253 != 0) * (uVar253 < 0x100) * cVar20 - (0xff < uVar253);
      dst[0x34] = (uVar255 != 0) * (uVar255 < 0x100) * cVar19 - (0xff < uVar255);
      dst[0x35] = (uVar257 != 0) * (uVar257 < 0x100) * cVar11 - (0xff < uVar257);
      dst[0x36] = (uVar259 != 0) * (uVar259 < 0x100) * cVar12 - (0xff < uVar259);
      dst[0x37] = (uVar261 != 0) * (uVar261 < 0x100) * cVar13 - (0xff < uVar261);
      dst[0x38] = (uVar378 != 0) * (uVar378 < 0x100) * bVar10 - (0xff < uVar378);
      dst[0x39] = (uVar403 != 0) * (uVar403 < 0x100) * cVar55 - (0xff < uVar403);
      dst[0x3a] = (uVar406 != 0) * (uVar406 < 0x100) * cVar54 - (0xff < uVar406);
      dst[0x3b] = (uVar411 != 0) * (uVar411 < 0x100) * cVar25 - (0xff < uVar411);
      dst[0x3c] = (uVar412 != 0) * (uVar412 < 0x100) * cVar56 - (0xff < uVar412);
      dst[0x3d] = (uVar413 != 0) * (uVar413 < 0x100) * cVar24 - (0xff < uVar413);
      dst[0x3e] = (uVar414 != 0) * (uVar414 < 0x100) * cVar23 - (0xff < uVar414);
      dst[0x3f] = (uVar415 != 0) * (uVar415 < 0x100) * cVar22 - (0xff < uVar415);
      dst[0x40] = (uVar292 != 0) * (uVar292 < 0x100) * bVar405 - (0xff < uVar292);
      dst[0x41] = (uVar315 != 0) * (uVar315 < 0x100) * cVar59 - (0xff < uVar315);
      dst[0x42] = (uVar316 != 0) * (uVar316 < 0x100) * cVar60 - (0xff < uVar316);
      dst[0x43] = (uVar317 != 0) * (uVar317 < 0x100) * cVar62 - (0xff < uVar317);
      dst[0x44] = (uVar318 != 0) * (uVar318 < 0x100) * cVar63 - (0xff < uVar318);
      dst[0x45] = (uVar319 != 0) * (uVar319 < 0x100) * cVar64 - (0xff < uVar319);
      dst[0x46] = (uVar320 != 0) * (uVar320 < 0x100) * cVar61 - (0xff < uVar320);
      dst[0x47] = (uVar321 != 0) * (uVar321 < 0x100) * cVar57 - (0xff < uVar321);
      dst[0x48] = (uVar227 != 0) * (uVar227 < 0x100) * bVar410 - (0xff < uVar227);
      dst[0x49] = (uVar250 != 0) * (uVar250 < 0x100) * cVar28 - (0xff < uVar250);
      dst[0x4a] = (uVar252 != 0) * (uVar252 < 0x100) * cVar31 - (0xff < uVar252);
      dst[0x4b] = (uVar254 != 0) * (uVar254 < 0x100) * cVar33 - (0xff < uVar254);
      dst[0x4c] = (uVar256 != 0) * (uVar256 < 0x100) * cVar32 - (0xff < uVar256);
      dst[0x4d] = (uVar258 != 0) * (uVar258 < 0x100) * cVar29 - (0xff < uVar258);
      dst[0x4e] = (uVar260 != 0) * (uVar260 < 0x100) * cVar27 - (0xff < uVar260);
      dst[0x4f] = (uVar262 != 0) * (uVar262 < 0x100) * cVar30 - (0xff < uVar262);
      dst[0x50] = (uVar263 != 0) * (uVar263 < 0x100) * bVar18 - (0xff < uVar263);
      dst[0x51] = (uVar285 != 0) * (uVar285 < 0x100) * cVar376 - (0xff < uVar285);
      dst[0x52] = (uVar286 != 0) * (uVar286 < 0x100) * cVar37 - (0xff < uVar286);
      dst[0x53] = (uVar287 != 0) * (uVar287 < 0x100) * cVar36 - (0xff < uVar287);
      dst[0x54] = (uVar288 != 0) * (uVar288 < 0x100) * cVar38 - (0xff < uVar288);
      dst[0x55] = (uVar289 != 0) * (uVar289 < 0x100) * cVar407 - (0xff < uVar289);
      dst[0x56] = (uVar290 != 0) * (uVar290 < 0x100) * cVar35 - (0xff < uVar290);
      dst[0x57] = (uVar291 != 0) * (uVar291 < 0x100) * cVar34 - (0xff < uVar291);
      dst[0x58] = (uVar322 != 0) * (uVar322 < 0x100) * bVar26 - (0xff < uVar322);
      dst[0x59] = (uVar342 != 0) * (uVar342 < 0x100) * cVar408 - (0xff < uVar342);
      dst[0x5a] = (uVar343 != 0) * (uVar343 < 0x100) * cVar43 - (0xff < uVar343);
      dst[0x5b] = (uVar344 != 0) * (uVar344 < 0x100) * cVar4 - (0xff < uVar344);
      dst[0x5c] = (uVar345 != 0) * (uVar345 < 0x100) * cVar5 - (0xff < uVar345);
      dst[0x5d] = (uVar346 != 0) * (uVar346 < 0x100) * cVar6 - (0xff < uVar346);
      dst[0x5e] = (uVar347 != 0) * (uVar347 < 0x100) * cVar7 - (0xff < uVar347);
      dst[0x5f] = (uVar348 != 0) * (uVar348 < 0x100) * cVar8 - (0xff < uVar348);
      src = (uint32_t *)((long)src + 0x80);
      dst = dst + 0x60;
      num_pixels = uVar165 - 0x20;
      bVar1 = 0x3f < uVar165;
      uVar165 = num_pixels;
    } while (bVar1);
  }
  if (num_pixels < 1) {
    return;
  }
  VP8LConvertBGRAToRGB_C(src,num_pixels,dst);
  return;
}

Assistant:

static void ConvertBGRAToRGB_SSE2(const uint32_t* src, int num_pixels,
                                  uint8_t* dst) {
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;

  while (num_pixels >= 32) {
    // Load the BGRA buffers.
    __m128i in0 = _mm_loadu_si128(in + 0);
    __m128i in1 = _mm_loadu_si128(in + 1);
    __m128i in2 = _mm_loadu_si128(in + 2);
    __m128i in3 = _mm_loadu_si128(in + 3);
    __m128i in4 = _mm_loadu_si128(in + 4);
    __m128i in5 = _mm_loadu_si128(in + 5);
    __m128i in6 = _mm_loadu_si128(in + 6);
    __m128i in7 = _mm_loadu_si128(in + 7);
    VP8L32bToPlanar_SSE2(&in0, &in1, &in2, &in3);
    VP8L32bToPlanar_SSE2(&in4, &in5, &in6, &in7);
    // At this points, in1/in5 contains red only, in2/in6 green only ...
    // Pack the colors in 24b RGB.
    VP8PlanarTo24b_SSE2(&in1, &in5, &in2, &in6, &in3, &in7);
    _mm_storeu_si128(out + 0, in1);
    _mm_storeu_si128(out + 1, in5);
    _mm_storeu_si128(out + 2, in2);
    _mm_storeu_si128(out + 3, in6);
    _mm_storeu_si128(out + 4, in3);
    _mm_storeu_si128(out + 5, in7);
    in += 8;
    out += 6;
    num_pixels -= 32;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGB_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}